

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersectorK<4,4>::
     occluded_h<embree::avx2::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx2::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [16];
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  long lVar18;
  ulong uVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [28];
  undefined1 auVar81 [12];
  byte bVar82;
  uint uVar83;
  ulong uVar84;
  long lVar85;
  uint uVar86;
  ulong uVar87;
  long lVar88;
  ulong uVar89;
  undefined8 uVar90;
  float fVar108;
  vint4 bi_2;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  float fVar107;
  float fVar109;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar96 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined4 uVar113;
  undefined8 uVar114;
  vint4 bi_1;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [64];
  float fVar131;
  float fVar132;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  vint4 ai_2;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [64];
  vint4 ai;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  vint4 bi;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [64];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [64];
  undefined4 uVar178;
  vint4 ai_1;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar193 [32];
  undefined1 auVar200 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar194 [64];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar198;
  float fVar203;
  undefined1 auVar199 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [64];
  float fVar209;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar208 [64];
  undefined1 auVar214 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  bool local_8cd;
  undefined1 local_8c0 [32];
  undefined1 local_880 [32];
  undefined4 local_860;
  undefined8 local_840;
  undefined8 uStack_838;
  ulong local_828;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 (*local_718) [16];
  RTCFilterFunctionNArguments local_710;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_630 [16];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  LinearSpace3fa *local_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  undefined8 uStack_4f8;
  undefined1 auStack_4f0 [8];
  float fStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 auStack_4d0 [16];
  undefined1 local_4c0 [32];
  undefined1 local_490 [16];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined4 uStack_444;
  undefined1 local_440 [32];
  undefined4 local_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  undefined4 local_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined1 local_3b0 [16];
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined4 local_300;
  undefined4 uStack_2fc;
  undefined4 uStack_2f8;
  undefined4 uStack_2f4;
  undefined4 local_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  int local_260;
  int local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined1 local_200 [32];
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined4 uStack_144;
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar6 = prim[1];
  uVar89 = (ulong)(byte)PVar6;
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar131 = *(float *)(prim + uVar89 * 0x19 + 0x12);
  auVar12 = vsubps_avx(auVar12,*(undefined1 (*) [16])(prim + uVar89 * 0x19 + 6));
  auVar91._0_4_ = fVar131 * auVar12._0_4_;
  auVar91._4_4_ = fVar131 * auVar12._4_4_;
  auVar91._8_4_ = fVar131 * auVar12._8_4_;
  auVar91._12_4_ = fVar131 * auVar12._12_4_;
  auVar161._0_4_ = fVar131 * auVar13._0_4_;
  auVar161._4_4_ = fVar131 * auVar13._4_4_;
  auVar161._8_4_ = fVar131 * auVar13._8_4_;
  auVar161._12_4_ = fVar131 * auVar13._12_4_;
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 4 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 5 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 6 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0xb + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar6 * 0xc + uVar89 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  uVar84 = (ulong)(uint)((int)(uVar89 * 9) * 2);
  auVar94 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 + 6)));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 + uVar89 + 6)));
  auVar93 = vcvtdq2ps_avx(auVar93);
  uVar84 = (ulong)(uint)((int)(uVar89 * 5) << 2);
  auVar133 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 + 6)));
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar204._4_4_ = auVar161._0_4_;
  auVar204._0_4_ = auVar161._0_4_;
  auVar204._8_4_ = auVar161._0_4_;
  auVar204._12_4_ = auVar161._0_4_;
  auVar116 = vshufps_avx(auVar161,auVar161,0x55);
  auVar92 = vshufps_avx(auVar161,auVar161,0xaa);
  fVar131 = auVar92._0_4_;
  auVar195._0_4_ = fVar131 * auVar14._0_4_;
  fVar132 = auVar92._4_4_;
  auVar195._4_4_ = fVar132 * auVar14._4_4_;
  fVar107 = auVar92._8_4_;
  auVar195._8_4_ = fVar107 * auVar14._8_4_;
  fVar108 = auVar92._12_4_;
  auVar195._12_4_ = fVar108 * auVar14._12_4_;
  auVar191._0_4_ = auVar17._0_4_ * fVar131;
  auVar191._4_4_ = auVar17._4_4_ * fVar132;
  auVar191._8_4_ = auVar17._8_4_ * fVar107;
  auVar191._12_4_ = auVar17._12_4_ * fVar108;
  auVar179._0_4_ = auVar133._0_4_ * fVar131;
  auVar179._4_4_ = auVar133._4_4_ * fVar132;
  auVar179._8_4_ = auVar133._8_4_ * fVar107;
  auVar179._12_4_ = auVar133._12_4_ * fVar108;
  auVar92 = vfmadd231ps_fma(auVar195,auVar116,auVar13);
  auVar117 = vfmadd231ps_fma(auVar191,auVar116,auVar16);
  auVar116 = vfmadd231ps_fma(auVar179,auVar93,auVar116);
  auVar148 = vfmadd231ps_fma(auVar92,auVar204,auVar12);
  auVar117 = vfmadd231ps_fma(auVar117,auVar204,auVar15);
  auVar156 = vfmadd231ps_fma(auVar116,auVar94,auVar204);
  auVar205._4_4_ = auVar91._0_4_;
  auVar205._0_4_ = auVar91._0_4_;
  auVar205._8_4_ = auVar91._0_4_;
  auVar205._12_4_ = auVar91._0_4_;
  auVar116 = vshufps_avx(auVar91,auVar91,0x55);
  auVar92 = vshufps_avx(auVar91,auVar91,0xaa);
  fVar131 = auVar92._0_4_;
  auVar162._0_4_ = fVar131 * auVar14._0_4_;
  fVar132 = auVar92._4_4_;
  auVar162._4_4_ = fVar132 * auVar14._4_4_;
  fVar107 = auVar92._8_4_;
  auVar162._8_4_ = fVar107 * auVar14._8_4_;
  fVar108 = auVar92._12_4_;
  auVar162._12_4_ = fVar108 * auVar14._12_4_;
  auVar115._0_4_ = auVar17._0_4_ * fVar131;
  auVar115._4_4_ = auVar17._4_4_ * fVar132;
  auVar115._8_4_ = auVar17._8_4_ * fVar107;
  auVar115._12_4_ = auVar17._12_4_ * fVar108;
  auVar92._0_4_ = auVar133._0_4_ * fVar131;
  auVar92._4_4_ = auVar133._4_4_ * fVar132;
  auVar92._8_4_ = auVar133._8_4_ * fVar107;
  auVar92._12_4_ = auVar133._12_4_ * fVar108;
  auVar13 = vfmadd231ps_fma(auVar162,auVar116,auVar13);
  auVar14 = vfmadd231ps_fma(auVar115,auVar116,auVar16);
  auVar16 = vfmadd231ps_fma(auVar92,auVar116,auVar93);
  auVar17 = vfmadd231ps_fma(auVar13,auVar205,auVar12);
  auVar93 = vfmadd231ps_fma(auVar14,auVar205,auVar15);
  auVar133 = vfmadd231ps_fma(auVar16,auVar205,auVar94);
  local_2d0._8_4_ = 0x7fffffff;
  local_2d0._0_8_ = 0x7fffffff7fffffff;
  local_2d0._12_4_ = 0x7fffffff;
  auVar12 = vandps_avx(auVar148,local_2d0);
  auVar155._8_4_ = 0x219392ef;
  auVar155._0_8_ = 0x219392ef219392ef;
  auVar155._12_4_ = 0x219392ef;
  auVar12 = vcmpps_avx(auVar12,auVar155,1);
  auVar13 = vblendvps_avx(auVar148,auVar155,auVar12);
  auVar12 = vandps_avx(auVar117,local_2d0);
  auVar12 = vcmpps_avx(auVar12,auVar155,1);
  auVar14 = vblendvps_avx(auVar117,auVar155,auVar12);
  auVar12 = vandps_avx(auVar156,local_2d0);
  auVar12 = vcmpps_avx(auVar12,auVar155,1);
  auVar12 = vblendvps_avx(auVar156,auVar155,auVar12);
  auVar15 = vrcpps_avx(auVar13);
  auVar174._8_4_ = 0x3f800000;
  auVar174._0_8_ = &DAT_3f8000003f800000;
  auVar174._12_4_ = 0x3f800000;
  auVar13 = vfnmadd213ps_fma(auVar13,auVar15,auVar174);
  auVar15 = vfmadd132ps_fma(auVar13,auVar15,auVar15);
  auVar13 = vrcpps_avx(auVar14);
  auVar14 = vfnmadd213ps_fma(auVar14,auVar13,auVar174);
  auVar16 = vfmadd132ps_fma(auVar14,auVar13,auVar13);
  auVar13 = vrcpps_avx(auVar12);
  auVar14 = vfnmadd213ps_fma(auVar12,auVar13,auVar174);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar89 * 7 + 6);
  auVar12 = vpmovsxwd_avx(auVar12);
  auVar94 = vfmadd132ps_fma(auVar14,auVar13,auVar13);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar17);
  auVar156._0_4_ = auVar15._0_4_ * auVar12._0_4_;
  auVar156._4_4_ = auVar15._4_4_ * auVar12._4_4_;
  auVar156._8_4_ = auVar15._8_4_ * auVar12._8_4_;
  auVar156._12_4_ = auVar15._12_4_ * auVar12._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar89 * 9 + 6);
  auVar12 = vpmovsxwd_avx(auVar13);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar17);
  auVar163._0_4_ = auVar15._0_4_ * auVar12._0_4_;
  auVar163._4_4_ = auVar15._4_4_ * auVar12._4_4_;
  auVar163._8_4_ = auVar15._8_4_ * auVar12._8_4_;
  auVar163._12_4_ = auVar15._12_4_ * auVar12._12_4_;
  auVar117._1_3_ = 0;
  auVar117[0] = PVar6;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  auVar13 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar89 * -2 + 6);
  auVar12 = vpmovsxwd_avx(auVar15);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar93);
  auVar180._0_4_ = auVar12._0_4_ * auVar16._0_4_;
  auVar180._4_4_ = auVar12._4_4_ * auVar16._4_4_;
  auVar180._8_4_ = auVar12._8_4_ * auVar16._8_4_;
  auVar180._12_4_ = auVar12._12_4_ * auVar16._12_4_;
  auVar12 = vcvtdq2ps_avx(auVar13);
  auVar12 = vsubps_avx(auVar12,auVar93);
  auVar116._0_4_ = auVar16._0_4_ * auVar12._0_4_;
  auVar116._4_4_ = auVar16._4_4_ * auVar12._4_4_;
  auVar116._8_4_ = auVar16._8_4_ * auVar12._8_4_;
  auVar116._12_4_ = auVar16._12_4_ * auVar12._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar84 + uVar89 + 6);
  auVar12 = vpmovsxwd_avx(auVar16);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar133);
  auVar148._0_4_ = auVar94._0_4_ * auVar12._0_4_;
  auVar148._4_4_ = auVar94._4_4_ * auVar12._4_4_;
  auVar148._8_4_ = auVar94._8_4_ * auVar12._8_4_;
  auVar148._12_4_ = auVar94._12_4_ * auVar12._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar89 * 0x17 + 6);
  auVar12 = vpmovsxwd_avx(auVar17);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar133);
  auVar93._0_4_ = auVar94._0_4_ * auVar12._0_4_;
  auVar93._4_4_ = auVar94._4_4_ * auVar12._4_4_;
  auVar93._8_4_ = auVar94._8_4_ * auVar12._8_4_;
  auVar93._12_4_ = auVar94._12_4_ * auVar12._12_4_;
  auVar12 = vpminsd_avx(auVar156,auVar163);
  auVar13 = vpminsd_avx(auVar180,auVar116);
  auVar12 = vmaxps_avx(auVar12,auVar13);
  auVar13 = vpminsd_avx(auVar148,auVar93);
  uVar113 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar186._4_4_ = uVar113;
  auVar186._0_4_ = uVar113;
  auVar186._8_4_ = uVar113;
  auVar186._12_4_ = uVar113;
  auVar13 = vmaxps_avx(auVar13,auVar186);
  auVar12 = vmaxps_avx(auVar12,auVar13);
  local_2e0._0_4_ = auVar12._0_4_ * 0.99999964;
  local_2e0._4_4_ = auVar12._4_4_ * 0.99999964;
  local_2e0._8_4_ = auVar12._8_4_ * 0.99999964;
  local_2e0._12_4_ = auVar12._12_4_ * 0.99999964;
  auVar12 = vpmaxsd_avx(auVar156,auVar163);
  auVar13 = vpmaxsd_avx(auVar180,auVar116);
  auVar12 = vminps_avx(auVar12,auVar13);
  auVar13 = vpmaxsd_avx(auVar148,auVar93);
  uVar113 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar133._4_4_ = uVar113;
  auVar133._0_4_ = uVar113;
  auVar133._8_4_ = uVar113;
  auVar133._12_4_ = uVar113;
  auVar13 = vminps_avx(auVar13,auVar133);
  auVar12 = vminps_avx(auVar12,auVar13);
  auVar94._0_4_ = auVar12._0_4_ * 1.0000004;
  auVar94._4_4_ = auVar12._4_4_ * 1.0000004;
  auVar94._8_4_ = auVar12._8_4_ * 1.0000004;
  auVar94._12_4_ = auVar12._12_4_ * 1.0000004;
  auVar117[4] = PVar6;
  auVar117._5_3_ = 0;
  auVar117[8] = PVar6;
  auVar117._9_3_ = 0;
  auVar117[0xc] = PVar6;
  auVar117._13_3_ = 0;
  auVar13 = vpcmpgtd_avx(auVar117,_DAT_01ff0cf0);
  auVar12 = vcmpps_avx(local_2e0,auVar94,2);
  auVar12 = vandps_avx(auVar12,auVar13);
  uVar83 = vmovmskps_avx(auVar12);
  local_8cd = uVar83 != 0;
  if (local_8cd) {
    uVar83 = uVar83 & 0xff;
    local_540 = mm_lookupmask_ps._16_8_;
    uStack_538 = mm_lookupmask_ps._24_8_;
    uStack_530 = mm_lookupmask_ps._16_8_;
    uStack_528 = mm_lookupmask_ps._24_8_;
    local_548 = pre->ray_space + k;
    local_718 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
    do {
      lVar18 = 0;
      for (uVar84 = (ulong)uVar83; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
        lVar18 = lVar18 + 1;
      }
      uVar7 = *(uint *)(prim + 2);
      local_828 = (ulong)uVar7;
      uVar8 = *(uint *)(prim + lVar18 * 4 + 6);
      pGVar10 = (context->scene->geometries).items[local_828].ptr;
      local_520._0_8_ = CONCAT44(0,uVar8);
      uVar84 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                               CONCAT44(0,uVar8) *
                               pGVar10[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      lVar88 = (long)pGVar10[1].intersectionFilterN * uVar84;
      uVar89 = (long)pGVar10[2].pointQueryFunc * (uVar84 + 1);
      lVar85 = (long)pGVar10[1].intersectionFilterN * (uVar84 + 1);
      lVar18 = *(long *)&pGVar10[1].time_range.upper;
      local_630 = *(undefined1 (*) [16])(lVar18 + lVar88);
      local_490 = *(undefined1 (*) [16])(lVar18 + lVar85);
      uVar113 = *(undefined4 *)(lVar18 + 0xc + lVar88);
      auVar175._4_4_ = uVar113;
      auVar175._0_4_ = uVar113;
      auVar175._8_4_ = uVar113;
      auVar175._12_4_ = uVar113;
      local_140._16_4_ = uVar113;
      local_140._0_16_ = auVar175;
      local_140._20_4_ = uVar113;
      local_140._24_4_ = uVar113;
      local_140._28_4_ = uVar113;
      iVar9 = (int)pGVar10[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar131 = *(float *)(lVar18 + 0xc + lVar85);
      auVar206._4_4_ = fVar131;
      auVar206._0_4_ = fVar131;
      auVar206._8_4_ = fVar131;
      auVar206._12_4_ = fVar131;
      fStack_150 = fVar131;
      _local_160 = auVar206;
      fStack_14c = fVar131;
      fStack_148 = fVar131;
      uStack_144 = fVar131;
      lVar18 = (long)iVar9 * 0x44;
      auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar118._8_4_ = 0xbeaaaaab;
      auVar118._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar118._12_4_ = 0xbeaaaaab;
      local_560 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                    (pGVar10[2].intersectionFilterN +
                                    uVar84 * (long)pGVar10[2].pointQueryFunc),local_630,auVar118);
      local_570 = vfmadd132ps_fma(*(undefined1 (*) [16])(pGVar10[2].intersectionFilterN + uVar89),
                                  local_490,auVar118);
      auVar14 = vsubps_avx(local_630,auVar12);
      uVar113 = auVar14._0_4_;
      auVar134._4_4_ = uVar113;
      auVar134._0_4_ = uVar113;
      auVar134._8_4_ = uVar113;
      auVar134._12_4_ = uVar113;
      auVar13 = vshufps_avx(auVar14,auVar14,0x55);
      auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
      aVar4 = (local_548->vx).field_0;
      aVar5 = (local_548->vy).field_0;
      fVar132 = (local_548->vz).field_0.m128[0];
      fVar107 = *(float *)((long)&(local_548->vz).field_0 + 4);
      fVar108 = *(float *)((long)&(local_548->vz).field_0 + 8);
      fVar109 = *(float *)((long)&(local_548->vz).field_0 + 0xc);
      auVar181._0_4_ = fVar132 * auVar14._0_4_;
      auVar181._4_4_ = fVar107 * auVar14._4_4_;
      auVar181._8_4_ = fVar108 * auVar14._8_4_;
      auVar181._12_4_ = fVar109 * auVar14._12_4_;
      auVar13 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar5,auVar13);
      auVar17 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar4,auVar134);
      auVar15 = vinsertps_avx(auVar17,auVar175,0x30);
      auVar14 = vsubps_avx(local_560,auVar12);
      uVar113 = auVar14._0_4_;
      auVar149._4_4_ = uVar113;
      auVar149._0_4_ = uVar113;
      auVar149._8_4_ = uVar113;
      auVar149._12_4_ = uVar113;
      auVar13 = vshufps_avx(auVar14,auVar14,0x55);
      auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
      auVar192._0_4_ = fVar132 * auVar14._0_4_;
      auVar192._4_4_ = fVar107 * auVar14._4_4_;
      auVar192._8_4_ = fVar108 * auVar14._8_4_;
      auVar192._12_4_ = fVar109 * auVar14._12_4_;
      auVar13 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar5,auVar13);
      auVar94 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar4,auVar149);
      auVar16 = vsubps_avx(local_570,auVar12);
      auVar13 = vshufps_avx(auVar16,auVar16,0x55);
      auVar14 = vshufps_avx(auVar16,auVar16,0xaa);
      auVar176._0_4_ = fVar132 * auVar14._0_4_;
      auVar176._4_4_ = fVar107 * auVar14._4_4_;
      auVar176._8_4_ = fVar108 * auVar14._8_4_;
      auVar176._12_4_ = fVar109 * auVar14._12_4_;
      auVar14 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar5,auVar13);
      auVar13 = vblendps_avx(auVar94,local_560,8);
      auVar135._0_4_ = auVar16._0_4_;
      auVar135._4_4_ = auVar135._0_4_;
      auVar135._8_4_ = auVar135._0_4_;
      auVar135._12_4_ = auVar135._0_4_;
      auVar93 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar4,auVar135);
      auVar16 = vsubps_avx(local_490,auVar12);
      auVar12 = vshufps_avx(auVar16,auVar16,0xaa);
      auVar199._0_4_ = fVar132 * auVar12._0_4_;
      auVar199._4_4_ = fVar107 * auVar12._4_4_;
      auVar199._8_4_ = fVar108 * auVar12._8_4_;
      auVar199._12_4_ = fVar109 * auVar12._12_4_;
      auVar12 = vshufps_avx(auVar16,auVar16,0x55);
      auVar12 = vfmadd231ps_fma(auVar199,(undefined1  [16])aVar5,auVar12);
      auVar14 = vblendps_avx(auVar93,local_570,8);
      auVar95._0_4_ = auVar16._0_4_;
      auVar95._4_4_ = auVar95._0_4_;
      auVar95._8_4_ = auVar95._0_4_;
      auVar95._12_4_ = auVar95._0_4_;
      auVar133 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar4,auVar95);
      auVar16 = vinsertps_avx(auVar133,auVar206,0x30);
      auVar12 = vandps_avx(auVar15,local_2d0);
      auVar13 = vandps_avx(auVar13,local_2d0);
      auVar15 = vmaxps_avx(auVar12,auVar13);
      auVar12 = vandps_avx(auVar14,local_2d0);
      auVar13 = vandps_avx(auVar16,local_2d0);
      auVar12 = vmaxps_avx(auVar12,auVar13);
      auVar12 = vmaxps_avx(auVar15,auVar12);
      auVar13 = vmovshdup_avx(auVar12);
      auVar13 = vmaxss_avx(auVar13,auVar12);
      auVar12 = vshufpd_avx(auVar12,auVar12,1);
      auVar12 = vmaxss_avx(auVar12,auVar13);
      auVar13 = vmovshdup_avx(auVar17);
      uVar90 = auVar13._0_8_;
      local_4c0._8_8_ = uVar90;
      local_4c0._0_8_ = uVar90;
      local_4c0._16_8_ = uVar90;
      local_4c0._24_8_ = uVar90;
      auVar13 = vmovshdup_avx(auVar94);
      local_860 = auVar94._0_4_;
      uVar90 = auVar13._0_8_;
      local_660._8_8_ = uVar90;
      local_660._0_8_ = uVar90;
      local_660._16_8_ = uVar90;
      local_660._24_8_ = uVar90;
      auVar160 = *(undefined1 (*) [32])(bezier_basis0 + lVar18 + 0x908);
      auVar13 = vmovshdup_avx(auVar93);
      uVar90 = auVar13._0_8_;
      local_7a0._8_8_ = uVar90;
      local_7a0._0_8_ = uVar90;
      local_7a0._16_8_ = uVar90;
      local_7a0._24_8_ = uVar90;
      auVar13 = vmovshdup_avx(auVar133);
      uVar90 = auVar13._0_8_;
      uVar113 = auVar93._0_4_;
      local_780._4_4_ = uVar113;
      local_780._0_4_ = uVar113;
      local_780._8_4_ = uVar113;
      local_780._12_4_ = uVar113;
      local_780._16_4_ = uVar113;
      local_780._20_4_ = uVar113;
      local_780._24_4_ = uVar113;
      local_780._28_4_ = uVar113;
      pauVar1 = (undefined1 (*) [32])(bezier_basis0 + lVar18 + 0xd8c);
      fVar132 = *(float *)*pauVar1;
      fVar107 = *(float *)(bezier_basis0 + lVar18 + 0xd90);
      fVar108 = *(float *)(bezier_basis0 + lVar18 + 0xd94);
      fVar109 = *(float *)(bezier_basis0 + lVar18 + 0xd98);
      fVar110 = *(float *)(bezier_basis0 + lVar18 + 0xd9c);
      fVar111 = *(float *)(bezier_basis0 + lVar18 + 0xda0);
      fVar112 = *(float *)(bezier_basis0 + lVar18 + 0xda4);
      auVar80 = *(undefined1 (*) [28])*pauVar1;
      local_760 = auVar133._0_4_;
      auVar150._0_4_ = fVar132 * local_760;
      auVar150._4_4_ = fVar107 * local_760;
      auVar150._8_4_ = fVar108 * local_760;
      auVar150._12_4_ = fVar109 * local_760;
      auVar150._16_4_ = fVar110 * local_760;
      auVar150._20_4_ = fVar111 * local_760;
      auVar150._24_4_ = fVar112 * local_760;
      auVar150._28_4_ = 0;
      auVar14 = vfmadd231ps_fma(auVar150,auVar160,local_780);
      local_740 = auVar13._0_4_;
      auVar142._0_4_ = fVar132 * local_740;
      fStack_73c = auVar13._4_4_;
      auVar142._4_4_ = fVar107 * fStack_73c;
      auVar142._8_4_ = fVar108 * local_740;
      auVar142._12_4_ = fVar109 * fStack_73c;
      auVar142._16_4_ = fVar110 * local_740;
      auVar142._20_4_ = fVar111 * fStack_73c;
      auVar142._24_4_ = fVar112 * local_740;
      auVar142._28_4_ = 0;
      auVar13 = vfmadd231ps_fma(auVar142,auVar160,local_7a0);
      auVar142 = *(undefined1 (*) [32])(bezier_basis0 + lVar18 + 0x484);
      local_7e0._4_4_ = local_860;
      local_7e0._0_4_ = local_860;
      local_7e0._8_4_ = local_860;
      local_7e0._12_4_ = local_860;
      local_7e0._16_4_ = local_860;
      local_7e0._20_4_ = local_860;
      local_7e0._24_4_ = local_860;
      local_7e0._28_4_ = local_860;
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar142,local_7e0);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar142,local_660);
      auVar150 = *(undefined1 (*) [32])(bezier_basis0 + lVar18);
      uVar178 = auVar17._0_4_;
      local_800._4_4_ = uVar178;
      local_800._0_4_ = uVar178;
      local_800._8_4_ = uVar178;
      local_800._12_4_ = uVar178;
      local_800._16_4_ = uVar178;
      local_800._20_4_ = uVar178;
      local_800._24_4_ = uVar178;
      local_800._28_4_ = uVar178;
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar150,local_800);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar150,local_4c0);
      auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar18 + 0x908);
      fVar67 = *(float *)(bezier_basis1 + lVar18 + 0xd8c);
      fVar68 = *(float *)(bezier_basis1 + lVar18 + 0xd90);
      fVar69 = *(float *)(bezier_basis1 + lVar18 + 0xd94);
      fVar70 = *(float *)(bezier_basis1 + lVar18 + 0xd98);
      fVar71 = *(float *)(bezier_basis1 + lVar18 + 0xd9c);
      fVar72 = *(float *)(bezier_basis1 + lVar18 + 0xda0);
      fVar73 = *(float *)(bezier_basis1 + lVar18 + 0xda4);
      auVar126._4_4_ = fVar68 * local_760;
      auVar126._0_4_ = fVar67 * local_760;
      auVar126._8_4_ = fVar69 * local_760;
      auVar126._12_4_ = fVar70 * local_760;
      auVar126._16_4_ = fVar71 * local_760;
      auVar126._20_4_ = fVar72 * local_760;
      auVar126._24_4_ = fVar73 * local_760;
      auVar126._28_4_ = local_760;
      auVar15 = vfmadd231ps_fma(auVar126,auVar104,local_780);
      auVar106._4_4_ = fVar68 * fStack_73c;
      auVar106._0_4_ = fVar67 * local_740;
      auVar106._8_4_ = fVar69 * local_740;
      auVar106._12_4_ = fVar70 * fStack_73c;
      auVar106._16_4_ = fVar71 * local_740;
      auVar106._20_4_ = fVar72 * fStack_73c;
      auVar106._24_4_ = fVar73 * local_740;
      auVar106._28_4_ = uVar113;
      auVar16 = vfmadd231ps_fma(auVar106,auVar104,local_7a0);
      auVar126 = *(undefined1 (*) [32])(bezier_basis1 + lVar18 + 0x484);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar126,local_7e0);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar126,local_660);
      auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar18);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar106,local_800);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar106,local_4c0);
      auVar97 = ZEXT1632(auVar15);
      auVar151 = ZEXT1632(auVar14);
      auVar128 = vsubps_avx(auVar97,auVar151);
      auVar121 = ZEXT1632(auVar16);
      auVar143 = ZEXT1632(auVar13);
      auVar146 = vsubps_avx(auVar121,auVar143);
      auVar98._0_4_ = auVar13._0_4_ * auVar128._0_4_;
      auVar98._4_4_ = auVar13._4_4_ * auVar128._4_4_;
      auVar98._8_4_ = auVar13._8_4_ * auVar128._8_4_;
      auVar98._12_4_ = auVar13._12_4_ * auVar128._12_4_;
      auVar98._16_4_ = auVar128._16_4_ * 0.0;
      auVar98._20_4_ = auVar128._20_4_ * 0.0;
      auVar98._24_4_ = auVar128._24_4_ * 0.0;
      auVar98._28_4_ = 0;
      fVar198 = auVar146._0_4_;
      auVar122._0_4_ = fVar198 * auVar14._0_4_;
      fVar203 = auVar146._4_4_;
      auVar122._4_4_ = fVar203 * auVar14._4_4_;
      fVar209 = auVar146._8_4_;
      auVar122._8_4_ = fVar209 * auVar14._8_4_;
      fVar210 = auVar146._12_4_;
      auVar122._12_4_ = fVar210 * auVar14._12_4_;
      fVar211 = auVar146._16_4_;
      auVar122._16_4_ = fVar211 * 0.0;
      fVar212 = auVar146._20_4_;
      auVar122._20_4_ = fVar212 * 0.0;
      fVar213 = auVar146._24_4_;
      auVar122._24_4_ = fVar213 * 0.0;
      auVar122._28_4_ = 0;
      auVar98 = vsubps_avx(auVar98,auVar122);
      auVar13 = vpermilps_avx(local_560,0xff);
      uVar114 = auVar13._0_8_;
      local_80._8_8_ = uVar114;
      local_80._0_8_ = uVar114;
      local_80._16_8_ = uVar114;
      local_80._24_8_ = uVar114;
      auVar14 = vpermilps_avx(local_570,0xff);
      local_a0._0_8_ = auVar14._0_8_;
      local_a0._8_8_ = local_a0._0_8_;
      local_a0._16_8_ = local_a0._0_8_;
      local_a0._24_8_ = local_a0._0_8_;
      auVar187._4_4_ = fVar107 * fVar131;
      auVar187._0_4_ = fVar132 * fVar131;
      auVar187._8_4_ = fVar108 * fVar131;
      auVar187._12_4_ = fVar109 * fVar131;
      auVar187._16_4_ = fVar110 * fVar131;
      auVar187._20_4_ = fVar111 * fVar131;
      auVar187._24_4_ = fVar112 * fVar131;
      auVar187._28_4_ = *(undefined4 *)(bezier_basis0 + lVar18 + 0xda8);
      auVar14 = vfmadd231ps_fma(auVar187,local_a0,auVar160);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar142,local_80);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar150,local_140);
      auVar105._4_4_ = fVar68 * fVar131;
      auVar105._0_4_ = fVar67 * fVar131;
      auVar105._8_4_ = fVar69 * fVar131;
      auVar105._12_4_ = fVar70 * fVar131;
      auVar105._16_4_ = fVar71 * fVar131;
      auVar105._20_4_ = fVar72 * fVar131;
      auVar105._24_4_ = fVar73 * fVar131;
      auVar105._28_4_ = auVar150._28_4_;
      auVar15 = vfmadd231ps_fma(auVar105,auVar104,local_a0);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar126,local_80);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar106,local_140);
      auVar182._4_4_ = fVar203 * fVar203;
      auVar182._0_4_ = fVar198 * fVar198;
      auVar182._8_4_ = fVar209 * fVar209;
      auVar182._12_4_ = fVar210 * fVar210;
      auVar182._16_4_ = fVar211 * fVar211;
      auVar182._20_4_ = fVar212 * fVar212;
      auVar182._24_4_ = fVar213 * fVar213;
      auVar182._28_4_ = auVar13._4_4_;
      auVar13 = vfmadd231ps_fma(auVar182,auVar128,auVar128);
      auVar187 = vmaxps_avx(ZEXT1632(auVar14),ZEXT1632(auVar15));
      auVar193._4_4_ = auVar187._4_4_ * auVar187._4_4_ * auVar13._4_4_;
      auVar193._0_4_ = auVar187._0_4_ * auVar187._0_4_ * auVar13._0_4_;
      auVar193._8_4_ = auVar187._8_4_ * auVar187._8_4_ * auVar13._8_4_;
      auVar193._12_4_ = auVar187._12_4_ * auVar187._12_4_ * auVar13._12_4_;
      auVar193._16_4_ = auVar187._16_4_ * auVar187._16_4_ * 0.0;
      auVar193._20_4_ = auVar187._20_4_ * auVar187._20_4_ * 0.0;
      auVar193._24_4_ = auVar187._24_4_ * auVar187._24_4_ * 0.0;
      auVar193._28_4_ = auVar187._28_4_;
      auVar200._4_4_ = auVar98._4_4_ * auVar98._4_4_;
      auVar200._0_4_ = auVar98._0_4_ * auVar98._0_4_;
      auVar200._8_4_ = auVar98._8_4_ * auVar98._8_4_;
      auVar200._12_4_ = auVar98._12_4_ * auVar98._12_4_;
      auVar200._16_4_ = auVar98._16_4_ * auVar98._16_4_;
      auVar200._20_4_ = auVar98._20_4_ * auVar98._20_4_;
      auVar200._24_4_ = auVar98._24_4_ * auVar98._24_4_;
      auVar200._28_4_ = 0;
      auVar187 = vcmpps_avx(auVar200,auVar193,2);
      fVar131 = auVar12._0_4_ * 4.7683716e-07;
      local_460._0_4_ = (undefined4)iVar9;
      register0x00001204 = auVar133._4_12_;
      auVar99._4_4_ = local_460._0_4_;
      auVar99._0_4_ = local_460._0_4_;
      auVar99._8_4_ = local_460._0_4_;
      auVar99._12_4_ = local_460._0_4_;
      auVar99._16_4_ = local_460._0_4_;
      auVar99._20_4_ = local_460._0_4_;
      auVar99._24_4_ = local_460._0_4_;
      auVar99._28_4_ = local_460._0_4_;
      auVar98 = vcmpps_avx(_DAT_02020f40,auVar99,1);
      auVar13 = vpermilps_avx(auVar17,0xaa);
      uVar114 = auVar13._0_8_;
      auVar166._8_8_ = uVar114;
      auVar166._0_8_ = uVar114;
      auVar166._16_8_ = uVar114;
      auVar166._24_8_ = uVar114;
      auVar12 = vpermilps_avx(auVar94,0xaa);
      uVar114 = auVar12._0_8_;
      local_440._8_8_ = uVar114;
      local_440._0_8_ = uVar114;
      local_440._16_8_ = uVar114;
      local_440._24_8_ = uVar114;
      auVar12 = vpermilps_avx(auVar93,0xaa);
      uVar114 = auVar12._0_8_;
      local_320._8_8_ = uVar114;
      local_320._0_8_ = uVar114;
      local_320._16_8_ = uVar114;
      local_320._24_8_ = uVar114;
      auVar12 = vshufps_avx(auVar133,auVar133,0xaa);
      uVar114 = auVar12._0_8_;
      register0x00001508 = uVar114;
      local_620 = uVar114;
      register0x00001510 = uVar114;
      register0x00001518 = uVar114;
      auVar202 = ZEXT3264(_local_620);
      auVar105 = auVar98 & auVar187;
      uVar86 = *(uint *)(ray + k * 4 + 0x30);
      local_820._0_16_ = ZEXT416(uVar86);
      fStack_75c = local_760;
      fStack_758 = local_760;
      fStack_754 = local_760;
      fStack_750 = local_760;
      fStack_74c = local_760;
      fStack_748 = local_760;
      fStack_744 = local_760;
      fStack_738 = local_740;
      fStack_734 = fStack_73c;
      fStack_730 = local_740;
      fStack_72c = fStack_73c;
      fStack_728 = local_740;
      fStack_724 = fStack_73c;
      if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar105 >> 0x7f,0) == '\0') &&
            (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar105 >> 0xbf,0) == '\0') &&
          (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar105[0x1f]) {
        uVar89 = 0;
        auVar130 = ZEXT3264(local_7a0);
        auVar173 = ZEXT3264(CONCAT428(fStack_73c,
                                      CONCAT424(local_740,
                                                CONCAT420(fStack_73c,
                                                          CONCAT416(local_740,
                                                                    CONCAT412(fStack_73c,
                                                                              CONCAT48(local_740,
                                                                                       uVar90)))))))
        ;
        auVar194 = ZEXT3264(local_780);
        auVar185 = ZEXT3264(CONCAT428(local_760,
                                      CONCAT424(local_760,
                                                CONCAT420(local_760,
                                                          CONCAT416(local_760,
                                                                    CONCAT412(local_760,
                                                                              CONCAT48(local_760,
                                                                                       CONCAT44(
                                                  local_760,local_760))))))));
        auVar208 = ZEXT3264(local_7e0);
        auVar214 = ZEXT3264(local_800);
      }
      else {
        local_340 = vandps_avx(auVar187,auVar98);
        fVar198 = auVar12._0_4_;
        fVar203 = auVar12._4_4_;
        auVar20._4_4_ = fVar203 * fVar68;
        auVar20._0_4_ = fVar198 * fVar67;
        auVar20._8_4_ = fVar198 * fVar69;
        auVar20._12_4_ = fVar203 * fVar70;
        auVar20._16_4_ = fVar198 * fVar71;
        auVar20._20_4_ = fVar203 * fVar72;
        auVar20._24_4_ = fVar198 * fVar73;
        auVar20._28_4_ = local_340._28_4_;
        auVar12 = vfmadd213ps_fma(auVar104,local_320,auVar20);
        auVar12 = vfmadd213ps_fma(auVar126,local_440,ZEXT1632(auVar12));
        auVar12 = vfmadd213ps_fma(auVar106,auVar166,ZEXT1632(auVar12));
        local_500._0_4_ = auVar80._0_4_;
        local_500._4_4_ = auVar80._4_4_;
        uStack_4f8._0_4_ = auVar80._8_4_;
        uStack_4f8._4_4_ = auVar80._12_4_;
        auStack_4f0._0_4_ = auVar80._16_4_;
        auStack_4f0._4_4_ = auVar80._20_4_;
        fStack_4e8 = auVar80._24_4_;
        auVar100._0_4_ = fVar198 * (float)local_500._0_4_;
        auVar100._4_4_ = fVar203 * (float)local_500._4_4_;
        auVar100._8_4_ = fVar198 * (float)uStack_4f8;
        auVar100._12_4_ = fVar203 * uStack_4f8._4_4_;
        auVar100._16_4_ = fVar198 * (float)auStack_4f0._0_4_;
        auVar100._20_4_ = fVar203 * (float)auStack_4f0._4_4_;
        auVar100._24_4_ = fVar198 * fStack_4e8;
        auVar100._28_4_ = 0;
        auVar16 = vfmadd213ps_fma(auVar160,local_320,auVar100);
        auVar16 = vfmadd213ps_fma(auVar142,local_440,ZEXT1632(auVar16));
        auVar160 = *(undefined1 (*) [32])(bezier_basis0 + lVar18 + 0x1210);
        auVar142 = *(undefined1 (*) [32])(bezier_basis0 + lVar18 + 0x1694);
        auVar126 = *(undefined1 (*) [32])(bezier_basis0 + lVar18 + 0x1b18);
        fVar132 = *(float *)(bezier_basis0 + lVar18 + 0x1f9c);
        fVar107 = *(float *)(bezier_basis0 + lVar18 + 0x1fa0);
        fVar108 = *(float *)(bezier_basis0 + lVar18 + 0x1fa4);
        fVar109 = *(float *)(bezier_basis0 + lVar18 + 0x1fa8);
        fVar110 = *(float *)(bezier_basis0 + lVar18 + 0x1fac);
        fVar111 = *(float *)(bezier_basis0 + lVar18 + 0x1fb0);
        fVar112 = *(float *)(bezier_basis0 + lVar18 + 0x1fb4);
        auVar21._4_4_ = local_760 * fVar107;
        auVar21._0_4_ = local_760 * fVar132;
        auVar21._8_4_ = local_760 * fVar108;
        auVar21._12_4_ = local_760 * fVar109;
        auVar21._16_4_ = local_760 * fVar110;
        auVar21._20_4_ = local_760 * fVar111;
        auVar21._24_4_ = local_760 * fVar112;
        auVar21._28_4_ = auVar13._4_4_;
        auVar22._4_4_ = fVar107 * fStack_73c;
        auVar22._0_4_ = fVar132 * local_740;
        auVar22._8_4_ = fVar108 * local_740;
        auVar22._12_4_ = fVar109 * fStack_73c;
        auVar22._16_4_ = fVar110 * local_740;
        auVar22._20_4_ = fVar111 * fStack_73c;
        auVar22._24_4_ = fVar112 * local_740;
        auVar22._28_4_ = auVar104._28_4_;
        auVar104._4_4_ = fVar203 * fVar107;
        auVar104._0_4_ = fVar198 * fVar132;
        auVar104._8_4_ = fVar198 * fVar108;
        auVar104._12_4_ = fVar203 * fVar109;
        auVar104._16_4_ = fVar198 * fVar110;
        auVar104._20_4_ = fVar203 * fVar111;
        auVar104._24_4_ = fVar198 * fVar112;
        auVar104._28_4_ = *(undefined4 *)(bezier_basis1 + lVar18 + 0xda8);
        auVar13 = vfmadd231ps_fma(auVar21,auVar126,local_780);
        auVar17 = vfmadd231ps_fma(auVar22,auVar126,local_7a0);
        auVar94 = vfmadd231ps_fma(auVar104,local_320,auVar126);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar142,local_7e0);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar142,local_660);
        auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),local_440,auVar142);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar160,local_800);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar160,local_4c0);
        auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar160,auVar166);
        fVar132 = *(float *)(bezier_basis1 + lVar18 + 0x1f9c);
        fVar107 = *(float *)(bezier_basis1 + lVar18 + 0x1fa0);
        fVar108 = *(float *)(bezier_basis1 + lVar18 + 0x1fa4);
        fVar109 = *(float *)(bezier_basis1 + lVar18 + 0x1fa8);
        fVar110 = *(float *)(bezier_basis1 + lVar18 + 0x1fac);
        fVar111 = *(float *)(bezier_basis1 + lVar18 + 0x1fb0);
        fVar112 = *(float *)(bezier_basis1 + lVar18 + 0x1fb4);
        auVar23._4_4_ = local_760 * fVar107;
        auVar23._0_4_ = local_760 * fVar132;
        auVar23._8_4_ = local_760 * fVar108;
        auVar23._12_4_ = local_760 * fVar109;
        auVar23._16_4_ = local_760 * fVar110;
        auVar23._20_4_ = local_760 * fVar111;
        auVar23._24_4_ = local_760 * fVar112;
        auVar23._28_4_ = fVar203;
        auVar24._4_4_ = fStack_73c * fVar107;
        auVar24._0_4_ = local_740 * fVar132;
        auVar24._8_4_ = local_740 * fVar108;
        auVar24._12_4_ = fStack_73c * fVar109;
        auVar24._16_4_ = local_740 * fVar110;
        auVar24._20_4_ = fStack_73c * fVar111;
        auVar24._24_4_ = local_740 * fVar112;
        auVar24._28_4_ = local_760;
        auVar25._4_4_ = fVar203 * fVar107;
        auVar25._0_4_ = fVar198 * fVar132;
        auVar25._8_4_ = fVar198 * fVar108;
        auVar25._12_4_ = fVar203 * fVar109;
        auVar25._16_4_ = fVar198 * fVar110;
        auVar25._20_4_ = fVar203 * fVar111;
        auVar25._24_4_ = fVar198 * fVar112;
        auVar25._28_4_ = fVar203;
        auVar160 = *(undefined1 (*) [32])(bezier_basis1 + lVar18 + 0x1b18);
        auVar93 = vfmadd231ps_fma(auVar23,auVar160,local_780);
        auVar133 = vfmadd231ps_fma(auVar24,auVar160,local_7a0);
        auVar116 = vfmadd231ps_fma(auVar25,local_320,auVar160);
        auVar160 = *(undefined1 (*) [32])(bezier_basis1 + lVar18 + 0x1694);
        auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar160,local_7e0);
        auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar160,local_660);
        auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),local_440,auVar160);
        auVar160 = *(undefined1 (*) [32])(bezier_basis1 + lVar18 + 0x1210);
        auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar160,local_800);
        auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar160,local_4c0);
        auVar123._8_4_ = 0x7fffffff;
        auVar123._0_8_ = 0x7fffffff7fffffff;
        auVar123._12_4_ = 0x7fffffff;
        auVar123._16_4_ = 0x7fffffff;
        auVar123._20_4_ = 0x7fffffff;
        auVar123._24_4_ = 0x7fffffff;
        auVar123._28_4_ = 0x7fffffff;
        auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar166,auVar160);
        auVar160 = vandps_avx(ZEXT1632(auVar13),auVar123);
        auVar142 = vandps_avx(ZEXT1632(auVar17),auVar123);
        auVar142 = vmaxps_avx(auVar160,auVar142);
        auVar160 = vandps_avx(ZEXT1632(auVar94),auVar123);
        auVar160 = vmaxps_avx(auVar142,auVar160);
        auVar144._4_4_ = fVar131;
        auVar144._0_4_ = fVar131;
        auVar144._8_4_ = fVar131;
        auVar144._12_4_ = fVar131;
        auVar144._16_4_ = fVar131;
        auVar144._20_4_ = fVar131;
        auVar144._24_4_ = fVar131;
        auVar144._28_4_ = fVar131;
        auVar160 = vcmpps_avx(auVar160,auVar144,1);
        auVar104 = vblendvps_avx(ZEXT1632(auVar13),auVar128,auVar160);
        auVar126 = vblendvps_avx(ZEXT1632(auVar17),auVar146,auVar160);
        auVar160 = vandps_avx(ZEXT1632(auVar93),auVar123);
        auVar142 = vandps_avx(ZEXT1632(auVar133),auVar123);
        auVar142 = vmaxps_avx(auVar160,auVar142);
        auVar160 = vandps_avx(ZEXT1632(auVar116),auVar123);
        auVar160 = vmaxps_avx(auVar142,auVar160);
        auVar106 = vcmpps_avx(auVar160,auVar144,1);
        auVar160 = vblendvps_avx(ZEXT1632(auVar93),auVar128,auVar106);
        auVar142 = vblendvps_avx(ZEXT1632(auVar133),auVar146,auVar106);
        auVar13 = vfmadd213ps_fma(auVar150,auVar166,ZEXT1632(auVar16));
        auVar16 = vfmadd213ps_fma(auVar104,auVar104,ZEXT832(0) << 0x20);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar126,auVar126);
        auVar150 = vrsqrtps_avx(ZEXT1632(auVar16));
        fVar132 = auVar150._0_4_;
        fVar107 = auVar150._4_4_;
        fVar108 = auVar150._8_4_;
        fVar109 = auVar150._12_4_;
        fVar110 = auVar150._16_4_;
        fVar111 = auVar150._20_4_;
        fVar112 = auVar150._24_4_;
        auVar128._4_4_ = fVar107 * fVar107 * fVar107 * auVar16._4_4_ * -0.5;
        auVar128._0_4_ = fVar132 * fVar132 * fVar132 * auVar16._0_4_ * -0.5;
        auVar128._8_4_ = fVar108 * fVar108 * fVar108 * auVar16._8_4_ * -0.5;
        auVar128._12_4_ = fVar109 * fVar109 * fVar109 * auVar16._12_4_ * -0.5;
        auVar128._16_4_ = fVar110 * fVar110 * fVar110 * -0.0;
        auVar128._20_4_ = fVar111 * fVar111 * fVar111 * -0.0;
        auVar128._24_4_ = fVar112 * fVar112 * fVar112 * -0.0;
        auVar128._28_4_ = 0;
        auVar196._8_4_ = 0x3fc00000;
        auVar196._0_8_ = 0x3fc000003fc00000;
        auVar196._12_4_ = 0x3fc00000;
        auVar196._16_4_ = 0x3fc00000;
        auVar196._20_4_ = 0x3fc00000;
        auVar196._24_4_ = 0x3fc00000;
        auVar196._28_4_ = 0x3fc00000;
        auVar16 = vfmadd231ps_fma(auVar128,auVar196,auVar150);
        fVar132 = auVar16._0_4_;
        fVar107 = auVar16._4_4_;
        auVar26._4_4_ = auVar126._4_4_ * fVar107;
        auVar26._0_4_ = auVar126._0_4_ * fVar132;
        fVar108 = auVar16._8_4_;
        auVar26._8_4_ = auVar126._8_4_ * fVar108;
        fVar109 = auVar16._12_4_;
        auVar26._12_4_ = auVar126._12_4_ * fVar109;
        auVar26._16_4_ = auVar126._16_4_ * 0.0;
        auVar26._20_4_ = auVar126._20_4_ * 0.0;
        auVar26._24_4_ = auVar126._24_4_ * 0.0;
        auVar26._28_4_ = auVar150._28_4_;
        auVar27._4_4_ = -auVar104._4_4_ * fVar107;
        auVar27._0_4_ = -auVar104._0_4_ * fVar132;
        auVar27._8_4_ = -auVar104._8_4_ * fVar108;
        auVar27._12_4_ = -auVar104._12_4_ * fVar109;
        auVar27._16_4_ = -auVar104._16_4_ * 0.0;
        auVar27._20_4_ = -auVar104._20_4_ * 0.0;
        auVar27._24_4_ = -auVar104._24_4_ * 0.0;
        auVar27._28_4_ = 0x80000000;
        auVar16 = vfmadd213ps_fma(auVar160,auVar160,ZEXT832(0) << 0x20);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar142,auVar142);
        auVar150 = vrsqrtps_avx(ZEXT1632(auVar16));
        auVar28._28_4_ = auVar106._28_4_;
        auVar28._0_28_ =
             ZEXT1628(CONCAT412(fVar109 * 0.0,
                                CONCAT48(fVar108 * 0.0,CONCAT44(fVar107 * 0.0,fVar132 * 0.0))));
        fVar132 = auVar150._0_4_;
        fVar107 = auVar150._4_4_;
        fVar108 = auVar150._8_4_;
        fVar109 = auVar150._12_4_;
        fVar110 = auVar150._16_4_;
        fVar111 = auVar150._20_4_;
        fVar112 = auVar150._24_4_;
        auVar29._4_4_ = fVar107 * fVar107 * fVar107 * auVar16._4_4_ * -0.5;
        auVar29._0_4_ = fVar132 * fVar132 * fVar132 * auVar16._0_4_ * -0.5;
        auVar29._8_4_ = fVar108 * fVar108 * fVar108 * auVar16._8_4_ * -0.5;
        auVar29._12_4_ = fVar109 * fVar109 * fVar109 * auVar16._12_4_ * -0.5;
        auVar29._16_4_ = fVar110 * fVar110 * fVar110 * -0.0;
        auVar29._20_4_ = fVar111 * fVar111 * fVar111 * -0.0;
        auVar29._24_4_ = fVar112 * fVar112 * fVar112 * -0.0;
        auVar29._28_4_ = 0;
        auVar16 = vfmadd231ps_fma(auVar29,auVar196,auVar150);
        fVar132 = auVar16._0_4_;
        fVar107 = auVar16._4_4_;
        auVar30._4_4_ = auVar142._4_4_ * fVar107;
        auVar30._0_4_ = auVar142._0_4_ * fVar132;
        fVar108 = auVar16._8_4_;
        auVar30._8_4_ = auVar142._8_4_ * fVar108;
        fVar109 = auVar16._12_4_;
        auVar30._12_4_ = auVar142._12_4_ * fVar109;
        auVar30._16_4_ = auVar142._16_4_ * 0.0;
        auVar30._20_4_ = auVar142._20_4_ * 0.0;
        auVar30._24_4_ = auVar142._24_4_ * 0.0;
        auVar30._28_4_ = auVar142._28_4_;
        auVar31._4_4_ = fVar107 * -auVar160._4_4_;
        auVar31._0_4_ = fVar132 * -auVar160._0_4_;
        auVar31._8_4_ = fVar108 * -auVar160._8_4_;
        auVar31._12_4_ = fVar109 * -auVar160._12_4_;
        auVar31._16_4_ = -auVar160._16_4_ * 0.0;
        auVar31._20_4_ = -auVar160._20_4_ * 0.0;
        auVar31._24_4_ = -auVar160._24_4_ * 0.0;
        auVar31._28_4_ = auVar104._28_4_ ^ 0x80000000;
        auVar160._28_4_ = auVar150._28_4_;
        auVar160._0_28_ =
             ZEXT1628(CONCAT412(fVar109 * 0.0,
                                CONCAT48(fVar108 * 0.0,CONCAT44(fVar107 * 0.0,fVar132 * 0.0))));
        auVar16 = vfmadd213ps_fma(auVar26,ZEXT1632(auVar14),auVar151);
        auVar122 = ZEXT1632(auVar14);
        auVar14 = vfmadd213ps_fma(auVar27,auVar122,auVar143);
        local_6c0 = ZEXT1632(auVar14);
        auVar14 = vfmadd213ps_fma(auVar28,auVar122,ZEXT1632(auVar13));
        auVar93 = vfnmadd213ps_fma(auVar26,auVar122,auVar151);
        auVar17 = vfmadd213ps_fma(auVar30,ZEXT1632(auVar15),auVar97);
        auVar133 = vfnmadd213ps_fma(auVar27,auVar122,auVar143);
        auVar142 = ZEXT1632(auVar15);
        auVar94 = vfmadd213ps_fma(auVar31,auVar142,auVar121);
        auVar117 = vfnmadd231ps_fma(ZEXT1632(auVar13),auVar122,auVar28);
        auVar13 = vfmadd213ps_fma(auVar160,auVar142,ZEXT1632(auVar12));
        auVar116 = vfnmadd213ps_fma(auVar30,auVar142,auVar97);
        auVar92 = vfnmadd213ps_fma(auVar31,auVar142,auVar121);
        local_6e0 = ZEXT1632(auVar15);
        auVar148 = vfnmadd231ps_fma(ZEXT1632(auVar12),local_6e0,auVar160);
        auVar160 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar133));
        auVar142 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar117));
        auVar97._4_4_ = auVar117._4_4_ * auVar160._4_4_;
        auVar97._0_4_ = auVar117._0_4_ * auVar160._0_4_;
        auVar97._8_4_ = auVar117._8_4_ * auVar160._8_4_;
        auVar97._12_4_ = auVar117._12_4_ * auVar160._12_4_;
        auVar97._16_4_ = auVar160._16_4_ * 0.0;
        auVar97._20_4_ = auVar160._20_4_ * 0.0;
        auVar97._24_4_ = auVar160._24_4_ * 0.0;
        auVar97._28_4_ = 0;
        auVar15 = vfmsub231ps_fma(auVar97,ZEXT1632(auVar133),auVar142);
        auVar121._4_4_ = auVar93._4_4_ * auVar142._4_4_;
        auVar121._0_4_ = auVar93._0_4_ * auVar142._0_4_;
        auVar121._8_4_ = auVar93._8_4_ * auVar142._8_4_;
        auVar121._12_4_ = auVar93._12_4_ * auVar142._12_4_;
        auVar121._16_4_ = auVar142._16_4_ * 0.0;
        auVar121._20_4_ = auVar142._20_4_ * 0.0;
        auVar121._24_4_ = auVar142._24_4_ * 0.0;
        auVar121._28_4_ = auVar142._28_4_;
        auVar187 = ZEXT1632(auVar93);
        auVar142 = vsubps_avx(ZEXT1632(auVar17),auVar187);
        auVar12 = vfmsub231ps_fma(auVar121,ZEXT1632(auVar117),auVar142);
        auVar143._4_4_ = auVar133._4_4_ * auVar142._4_4_;
        auVar143._0_4_ = auVar133._0_4_ * auVar142._0_4_;
        auVar143._8_4_ = auVar133._8_4_ * auVar142._8_4_;
        auVar143._12_4_ = auVar133._12_4_ * auVar142._12_4_;
        auVar143._16_4_ = auVar142._16_4_ * 0.0;
        auVar143._20_4_ = auVar142._20_4_ * 0.0;
        auVar143._24_4_ = auVar142._24_4_ * 0.0;
        auVar143._28_4_ = auVar142._28_4_;
        auVar93 = vfmsub231ps_fma(auVar143,auVar187,auVar160);
        auVar160 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar160,ZEXT1632(auVar12));
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar160,ZEXT1632(auVar15));
        auVar105 = vcmpps_avx(ZEXT1632(auVar12),ZEXT1232(ZEXT812(0)) << 0x20,2);
        auVar160 = vblendvps_avx(ZEXT1632(auVar116),ZEXT1632(auVar16),auVar105);
        auVar142 = vblendvps_avx(ZEXT1632(auVar92),local_6c0,auVar105);
        auVar150 = vblendvps_avx(ZEXT1632(auVar148),ZEXT1632(auVar14),auVar105);
        auVar104 = vblendvps_avx(auVar187,ZEXT1632(auVar17),auVar105);
        auVar126 = vblendvps_avx(ZEXT1632(auVar133),ZEXT1632(auVar94),auVar105);
        auVar106 = vblendvps_avx(ZEXT1632(auVar117),ZEXT1632(auVar13),auVar105);
        auVar187 = vblendvps_avx(ZEXT1632(auVar17),auVar187,auVar105);
        auVar98 = vblendvps_avx(ZEXT1632(auVar94),ZEXT1632(auVar133),auVar105);
        auVar12 = vpackssdw_avx(local_340._0_16_,local_340._16_16_);
        auVar128 = vblendvps_avx(ZEXT1632(auVar13),ZEXT1632(auVar117),auVar105);
        auVar182 = vsubps_avx(auVar187,auVar160);
        auVar98 = vsubps_avx(auVar98,auVar142);
        auVar193 = vsubps_avx(auVar128,auVar150);
        auVar200 = vsubps_avx(auVar160,auVar104);
        auVar97 = vsubps_avx(auVar142,auVar126);
        auVar99 = vsubps_avx(auVar150,auVar106);
        auVar151._4_4_ = auVar193._4_4_ * auVar160._4_4_;
        auVar151._0_4_ = auVar193._0_4_ * auVar160._0_4_;
        auVar151._8_4_ = auVar193._8_4_ * auVar160._8_4_;
        auVar151._12_4_ = auVar193._12_4_ * auVar160._12_4_;
        auVar151._16_4_ = auVar193._16_4_ * auVar160._16_4_;
        auVar151._20_4_ = auVar193._20_4_ * auVar160._20_4_;
        auVar151._24_4_ = auVar193._24_4_ * auVar160._24_4_;
        auVar151._28_4_ = auVar128._28_4_;
        auVar13 = vfmsub231ps_fma(auVar151,auVar150,auVar182);
        auVar32._4_4_ = auVar182._4_4_ * auVar142._4_4_;
        auVar32._0_4_ = auVar182._0_4_ * auVar142._0_4_;
        auVar32._8_4_ = auVar182._8_4_ * auVar142._8_4_;
        auVar32._12_4_ = auVar182._12_4_ * auVar142._12_4_;
        auVar32._16_4_ = auVar182._16_4_ * auVar142._16_4_;
        auVar32._20_4_ = auVar182._20_4_ * auVar142._20_4_;
        auVar32._24_4_ = auVar182._24_4_ * auVar142._24_4_;
        auVar32._28_4_ = auVar187._28_4_;
        auVar14 = vfmsub231ps_fma(auVar32,auVar160,auVar98);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
        auVar101._0_4_ = auVar98._0_4_ * auVar150._0_4_;
        auVar101._4_4_ = auVar98._4_4_ * auVar150._4_4_;
        auVar101._8_4_ = auVar98._8_4_ * auVar150._8_4_;
        auVar101._12_4_ = auVar98._12_4_ * auVar150._12_4_;
        auVar101._16_4_ = auVar98._16_4_ * auVar150._16_4_;
        auVar101._20_4_ = auVar98._20_4_ * auVar150._20_4_;
        auVar101._24_4_ = auVar98._24_4_ * auVar150._24_4_;
        auVar101._28_4_ = 0;
        auVar14 = vfmsub231ps_fma(auVar101,auVar142,auVar193);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
        auVar102._0_4_ = auVar99._0_4_ * auVar104._0_4_;
        auVar102._4_4_ = auVar99._4_4_ * auVar104._4_4_;
        auVar102._8_4_ = auVar99._8_4_ * auVar104._8_4_;
        auVar102._12_4_ = auVar99._12_4_ * auVar104._12_4_;
        auVar102._16_4_ = auVar99._16_4_ * auVar104._16_4_;
        auVar102._20_4_ = auVar99._20_4_ * auVar104._20_4_;
        auVar102._24_4_ = auVar99._24_4_ * auVar104._24_4_;
        auVar102._28_4_ = 0;
        auVar13 = vfmsub231ps_fma(auVar102,auVar200,auVar106);
        auVar33._4_4_ = auVar97._4_4_ * auVar106._4_4_;
        auVar33._0_4_ = auVar97._0_4_ * auVar106._0_4_;
        auVar33._8_4_ = auVar97._8_4_ * auVar106._8_4_;
        auVar33._12_4_ = auVar97._12_4_ * auVar106._12_4_;
        auVar33._16_4_ = auVar97._16_4_ * auVar106._16_4_;
        auVar33._20_4_ = auVar97._20_4_ * auVar106._20_4_;
        auVar33._24_4_ = auVar97._24_4_ * auVar106._24_4_;
        auVar33._28_4_ = auVar106._28_4_;
        auVar15 = vfmsub231ps_fma(auVar33,auVar126,auVar99);
        auVar34._4_4_ = auVar200._4_4_ * auVar126._4_4_;
        auVar34._0_4_ = auVar200._0_4_ * auVar126._0_4_;
        auVar34._8_4_ = auVar200._8_4_ * auVar126._8_4_;
        auVar34._12_4_ = auVar200._12_4_ * auVar126._12_4_;
        auVar34._16_4_ = auVar200._16_4_ * auVar126._16_4_;
        auVar34._20_4_ = auVar200._20_4_ * auVar126._20_4_;
        auVar34._24_4_ = auVar200._24_4_ * auVar126._24_4_;
        auVar34._28_4_ = auVar126._28_4_;
        auVar16 = vfmsub231ps_fma(auVar34,auVar97,auVar104);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
        auVar104 = vmaxps_avx(ZEXT1632(auVar14),ZEXT1632(auVar15));
        auVar104 = vcmpps_avx(auVar104,ZEXT832(0) << 0x20,2);
        auVar13 = vpackssdw_avx(auVar104._0_16_,auVar104._16_16_);
        auVar12 = vpand_avx(auVar13,auVar12);
        auVar104 = vpmovsxwd_avx2(auVar12);
        if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar104 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar104 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar104 >> 0x7f,0) == '\0') &&
              (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar104 >> 0xbf,0) == '\0') &&
            (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar104[0x1f]) {
LAB_016a0743:
          auVar173 = ZEXT3264(CONCAT824(uStack_528,
                                        CONCAT816(uStack_530,CONCAT88(uStack_538,local_540))));
          auVar154 = ZEXT3264(local_5a0);
          auVar130 = ZEXT3264(local_5c0);
        }
        else {
          auVar35._4_4_ = auVar98._4_4_ * auVar99._4_4_;
          auVar35._0_4_ = auVar98._0_4_ * auVar99._0_4_;
          auVar35._8_4_ = auVar98._8_4_ * auVar99._8_4_;
          auVar35._12_4_ = auVar98._12_4_ * auVar99._12_4_;
          auVar35._16_4_ = auVar98._16_4_ * auVar99._16_4_;
          auVar35._20_4_ = auVar98._20_4_ * auVar99._20_4_;
          auVar35._24_4_ = auVar98._24_4_ * auVar99._24_4_;
          auVar35._28_4_ = auVar104._28_4_;
          auVar94 = vfmsub231ps_fma(auVar35,auVar97,auVar193);
          auVar124._0_4_ = auVar200._0_4_ * auVar193._0_4_;
          auVar124._4_4_ = auVar200._4_4_ * auVar193._4_4_;
          auVar124._8_4_ = auVar200._8_4_ * auVar193._8_4_;
          auVar124._12_4_ = auVar200._12_4_ * auVar193._12_4_;
          auVar124._16_4_ = auVar200._16_4_ * auVar193._16_4_;
          auVar124._20_4_ = auVar200._20_4_ * auVar193._20_4_;
          auVar124._24_4_ = auVar200._24_4_ * auVar193._24_4_;
          auVar124._28_4_ = 0;
          auVar17 = vfmsub231ps_fma(auVar124,auVar182,auVar99);
          auVar36._4_4_ = auVar182._4_4_ * auVar97._4_4_;
          auVar36._0_4_ = auVar182._0_4_ * auVar97._0_4_;
          auVar36._8_4_ = auVar182._8_4_ * auVar97._8_4_;
          auVar36._12_4_ = auVar182._12_4_ * auVar97._12_4_;
          auVar36._16_4_ = auVar182._16_4_ * auVar97._16_4_;
          auVar36._20_4_ = auVar182._20_4_ * auVar97._20_4_;
          auVar36._24_4_ = auVar182._24_4_ * auVar97._24_4_;
          auVar36._28_4_ = auVar182._28_4_;
          auVar93 = vfmsub231ps_fma(auVar36,auVar200,auVar98);
          auVar13 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar17),ZEXT1632(auVar93));
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT1632(auVar94),_DAT_02020f00);
          auVar104 = vrcpps_avx(ZEXT1632(auVar16));
          auVar197._8_4_ = 0x3f800000;
          auVar197._0_8_ = &DAT_3f8000003f800000;
          auVar197._12_4_ = 0x3f800000;
          auVar197._16_4_ = 0x3f800000;
          auVar197._20_4_ = 0x3f800000;
          auVar197._24_4_ = 0x3f800000;
          auVar197._28_4_ = 0x3f800000;
          auVar13 = vfnmadd213ps_fma(auVar104,ZEXT1632(auVar16),auVar197);
          auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar104,auVar104);
          auVar167._0_4_ = auVar150._0_4_ * auVar93._0_4_;
          auVar167._4_4_ = auVar150._4_4_ * auVar93._4_4_;
          auVar167._8_4_ = auVar150._8_4_ * auVar93._8_4_;
          auVar167._12_4_ = auVar150._12_4_ * auVar93._12_4_;
          auVar167._16_4_ = auVar150._16_4_ * 0.0;
          auVar167._20_4_ = auVar150._20_4_ * 0.0;
          auVar167._24_4_ = auVar150._24_4_ * 0.0;
          auVar167._28_4_ = 0;
          auVar17 = vfmadd231ps_fma(auVar167,auVar142,ZEXT1632(auVar17));
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT1632(auVar94),auVar160);
          fVar132 = auVar13._0_4_;
          fVar107 = auVar13._4_4_;
          fVar108 = auVar13._8_4_;
          fVar109 = auVar13._12_4_;
          auVar150 = ZEXT1632(CONCAT412(fVar109 * auVar17._12_4_,
                                        CONCAT48(fVar108 * auVar17._8_4_,
                                                 CONCAT44(fVar107 * auVar17._4_4_,
                                                          fVar132 * auVar17._0_4_))));
          auVar103._4_4_ = uVar86;
          auVar103._0_4_ = uVar86;
          auVar103._8_4_ = uVar86;
          auVar103._12_4_ = uVar86;
          auVar103._16_4_ = uVar86;
          auVar103._20_4_ = uVar86;
          auVar103._24_4_ = uVar86;
          auVar103._28_4_ = uVar86;
          uVar113 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar125._4_4_ = uVar113;
          auVar125._0_4_ = uVar113;
          auVar125._8_4_ = uVar113;
          auVar125._12_4_ = uVar113;
          auVar125._16_4_ = uVar113;
          auVar125._20_4_ = uVar113;
          auVar125._24_4_ = uVar113;
          auVar125._28_4_ = uVar113;
          auVar160 = vcmpps_avx(auVar103,auVar150,2);
          auVar142 = vcmpps_avx(auVar150,auVar125,2);
          auVar160 = vandps_avx(auVar142,auVar160);
          auVar13 = vpackssdw_avx(auVar160._0_16_,auVar160._16_16_);
          auVar12 = vpand_avx(auVar12,auVar13);
          auVar160 = vpmovsxwd_avx2(auVar12);
          if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar160 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar160 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar160 >> 0x7f,0) == '\0') &&
                (auVar160 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar160 >> 0xbf,0) == '\0') &&
              (auVar160 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar160[0x1f]) goto LAB_016a0743;
          auVar160 = vcmpps_avx(ZEXT1632(auVar16),ZEXT832(0) << 0x20,4);
          auVar13 = vpackssdw_avx(auVar160._0_16_,auVar160._16_16_);
          auVar12 = vpand_avx(auVar12,auVar13);
          auVar160 = vpmovsxwd_avx2(auVar12);
          auVar173 = ZEXT3264(CONCAT824(uStack_528,
                                        CONCAT816(uStack_530,CONCAT88(uStack_538,local_540))));
          auVar154 = ZEXT3264(local_5a0);
          auVar130 = ZEXT3264(local_5c0);
          if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar160 >> 0x7f,0) != '\0') ||
                (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar160 >> 0xbf,0) != '\0') ||
              (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar160[0x1f] < '\0') {
            auVar104 = ZEXT1632(CONCAT412(fVar109 * auVar14._12_4_,
                                          CONCAT48(fVar108 * auVar14._8_4_,
                                                   CONCAT44(fVar107 * auVar14._4_4_,
                                                            fVar132 * auVar14._0_4_))));
            auVar126 = ZEXT1632(CONCAT412(fVar109 * auVar15._12_4_,
                                          CONCAT48(fVar108 * auVar15._8_4_,
                                                   CONCAT44(fVar107 * auVar15._4_4_,
                                                            fVar132 * auVar15._0_4_))));
            auVar159._8_4_ = 0x3f800000;
            auVar159._0_8_ = &DAT_3f8000003f800000;
            auVar159._12_4_ = 0x3f800000;
            auVar159._16_4_ = 0x3f800000;
            auVar159._20_4_ = 0x3f800000;
            auVar159._24_4_ = 0x3f800000;
            auVar159._28_4_ = 0x3f800000;
            auVar142 = vsubps_avx(auVar159,auVar104);
            auVar142 = vblendvps_avx(auVar142,auVar104,auVar105);
            auVar154 = ZEXT3264(auVar142);
            auVar142 = vsubps_avx(auVar159,auVar126);
            local_360 = vblendvps_avx(auVar142,auVar126,auVar105);
            auVar173 = ZEXT3264(auVar160);
            auVar130 = ZEXT3264(auVar150);
          }
        }
        auVar214 = ZEXT3264(local_800);
        auVar208 = ZEXT3264(local_7e0);
        auVar202 = ZEXT3264(_local_620);
        auVar194 = ZEXT3264(local_780);
        local_5a0 = auVar154._0_32_;
        local_5c0 = auVar130._0_32_;
        auVar160 = auVar173._0_32_;
        if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar160 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar160 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar160 >> 0x7f,0) == '\0') &&
              (auVar173 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar160 >> 0xbf,0) == '\0') &&
            (auVar173 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar173[0x1f]) {
          uVar89 = 0;
          auVar130 = ZEXT3264(local_7a0);
          auVar173 = ZEXT3264(CONCAT428(fStack_73c,
                                        CONCAT424(local_740,
                                                  CONCAT420(fStack_73c,
                                                            CONCAT416(local_740,
                                                                      CONCAT412(fStack_73c,
                                                                                CONCAT48(local_740,
                                                                                         uVar90)))))
                                       ));
          auVar185 = ZEXT3264(CONCAT428(local_760,
                                        CONCAT424(local_760,
                                                  CONCAT420(local_760,
                                                            CONCAT416(local_760,
                                                                      CONCAT412(local_760,
                                                                                CONCAT48(local_760,
                                                                                         CONCAT44(
                                                  local_760,local_760))))))));
        }
        else {
          auVar142 = vsubps_avx(local_6e0,auVar122);
          auVar12 = vfmadd213ps_fma(auVar142,local_5a0,auVar122);
          fVar132 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
          auVar37._4_4_ = (auVar12._4_4_ + auVar12._4_4_) * fVar132;
          auVar37._0_4_ = (auVar12._0_4_ + auVar12._0_4_) * fVar132;
          auVar37._8_4_ = (auVar12._8_4_ + auVar12._8_4_) * fVar132;
          auVar37._12_4_ = (auVar12._12_4_ + auVar12._12_4_) * fVar132;
          auVar37._16_4_ = fVar132 * 0.0;
          auVar37._20_4_ = fVar132 * 0.0;
          auVar37._24_4_ = fVar132 * 0.0;
          auVar37._28_4_ = 0;
          auVar142 = vcmpps_avx(local_5c0,auVar37,6);
          auVar150 = auVar160 & auVar142;
          auVar173 = ZEXT3264(CONCAT428(fStack_73c,
                                        CONCAT424(local_740,
                                                  CONCAT420(fStack_73c,
                                                            CONCAT416(local_740,
                                                                      CONCAT412(fStack_73c,
                                                                                CONCAT48(local_740,
                                                                                         uVar90)))))
                                       ));
          auVar185 = ZEXT3264(CONCAT428(local_760,
                                        CONCAT424(local_760,
                                                  CONCAT420(local_760,
                                                            CONCAT416(local_760,
                                                                      CONCAT412(local_760,
                                                                                CONCAT48(local_760,
                                                                                         CONCAT44(
                                                  local_760,local_760))))))));
          if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar150 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar150 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar150 >> 0x7f,0) == '\0') &&
                (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar150 >> 0xbf,0) == '\0') &&
              (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar150[0x1f]) {
LAB_0169f774:
            uVar89 = 0;
          }
          else {
            local_200 = vandps_avx(auVar142,auVar160);
            auVar127._8_4_ = 0xbf800000;
            auVar127._0_8_ = 0xbf800000bf800000;
            auVar127._12_4_ = 0xbf800000;
            auVar127._16_4_ = 0xbf800000;
            auVar127._20_4_ = 0xbf800000;
            auVar127._24_4_ = 0xbf800000;
            auVar127._28_4_ = 0xbf800000;
            auVar145._8_4_ = 0x40000000;
            auVar145._0_8_ = 0x4000000040000000;
            auVar145._12_4_ = 0x40000000;
            auVar145._16_4_ = 0x40000000;
            auVar145._20_4_ = 0x40000000;
            auVar145._24_4_ = 0x40000000;
            auVar145._28_4_ = 0x40000000;
            auVar12 = vfmadd213ps_fma(local_360,auVar145,auVar127);
            local_2a0 = ZEXT1632(auVar12);
            local_260 = 0;
            local_250 = local_630._0_8_;
            uStack_248 = local_630._8_8_;
            local_240 = local_560._0_8_;
            uStack_238 = local_560._8_8_;
            local_230 = local_570._0_8_;
            uStack_228 = local_570._8_8_;
            local_220 = local_490._0_8_;
            uStack_218 = local_490._8_8_;
            local_360 = local_2a0;
            if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_0169f774;
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (uVar89 = CONCAT71((int7)(uVar89 >> 8),1),
               pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar177 = ZEXT3264(auVar166);
              fVar132 = 1.0 / (float)local_460._0_4_;
              local_1e0[0] = fVar132 * (auVar154._0_4_ + 0.0);
              local_1e0[1] = fVar132 * (auVar154._4_4_ + 1.0);
              local_1e0[2] = fVar132 * (auVar154._8_4_ + 2.0);
              local_1e0[3] = fVar132 * (auVar154._12_4_ + 3.0);
              fStack_1d0 = fVar132 * (auVar154._16_4_ + 4.0);
              fStack_1cc = fVar132 * (auVar154._20_4_ + 5.0);
              fStack_1c8 = fVar132 * (auVar154._24_4_ + 6.0);
              fStack_1c4 = auVar154._28_4_ + 7.0;
              local_360._0_8_ = auVar12._0_8_;
              local_360._8_8_ = auVar12._8_8_;
              local_1c0 = local_360._0_8_;
              uStack_1b8 = local_360._8_8_;
              uStack_1b0 = 0;
              uStack_1a8 = 0;
              local_1a0 = local_5c0;
              uVar86 = vmovmskps_avx(local_200);
              uVar89 = CONCAT71((int7)(uVar89 >> 8),uVar86 != 0);
              auVar160 = local_5c0;
              auVar142 = local_5a0;
              if (uVar86 != 0) {
                uVar84 = 0;
                uVar87 = (ulong)(uVar86 & 0xff);
                for (uVar19 = uVar87; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000)
                {
                  uVar84 = uVar84 + 1;
                }
                local_5e0._0_16_ = CONCAT412(uVar7,CONCAT48(uVar7,CONCAT44(uVar7,uVar7)));
                local_5e0 = ZEXT1632(local_5e0._0_16_);
                local_680._0_8_ = CONCAT44(uVar8,uVar8);
                local_680._0_16_ = CONCAT412(uVar8,CONCAT48(uVar8,local_680._0_8_));
                local_680 = ZEXT1632(local_680._0_16_);
                _local_600 = ZEXT1632(local_560);
                local_6a0 = ZEXT1632(local_570);
                auStack_4d0 = auVar146._16_16_;
                _local_4e0 = local_490;
                _auStack_4f0 = SUB3216(*pauVar1,0x10);
                _local_500 = *local_718;
                local_7c0 = auVar166;
                local_2c0 = local_5a0;
                local_280 = local_5c0;
                local_25c = iVar9;
                do {
                  local_6c0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_3e0 = local_1e0[uVar84];
                  local_3d0 = *(undefined4 *)((long)&local_1c0 + uVar84 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1a0 + uVar84 * 4);
                  fVar108 = 1.0 - local_3e0;
                  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar108 * fVar108)),
                                            ZEXT416((uint)(local_3e0 * fVar108)),ZEXT416(0xc0000000)
                                           );
                  auVar12 = vfmsub132ss_fma(ZEXT416((uint)(local_3e0 * fVar108)),
                                            ZEXT416((uint)(local_3e0 * local_3e0)),
                                            ZEXT416(0x40000000));
                  fVar132 = auVar12._0_4_ * 3.0;
                  fVar107 = local_3e0 * local_3e0 * 3.0;
                  auVar165._0_4_ = fVar107 * (float)local_4e0._0_4_;
                  auVar165._4_4_ = fVar107 * (float)local_4e0._4_4_;
                  auVar165._8_4_ = fVar107 * fStack_4d8;
                  auVar165._12_4_ = fVar107 * fStack_4d4;
                  auVar139._4_4_ = fVar132;
                  auVar139._0_4_ = fVar132;
                  auVar139._8_4_ = fVar132;
                  auVar139._12_4_ = fVar132;
                  auVar12 = vfmadd132ps_fma(auVar139,auVar165,local_6a0._0_16_);
                  fVar132 = auVar13._0_4_ * 3.0;
                  auVar158._4_4_ = fVar132;
                  auVar158._0_4_ = fVar132;
                  auVar158._8_4_ = fVar132;
                  auVar158._12_4_ = fVar132;
                  auVar12 = vfmadd132ps_fma(auVar158,auVar12,_local_600);
                  fVar132 = fVar108 * fVar108 * -3.0;
                  local_710.context = context->user;
                  auVar140._4_4_ = fVar132;
                  auVar140._0_4_ = fVar132;
                  auVar140._8_4_ = fVar132;
                  auVar140._12_4_ = fVar132;
                  auVar12 = vfmadd132ps_fma(auVar140,auVar12,local_630);
                  local_410 = auVar12._0_4_;
                  local_400 = vshufps_avx(auVar12,auVar12,0x55);
                  local_3f0 = vshufps_avx(auVar12,auVar12,0xaa);
                  local_3c0 = local_680._0_8_;
                  uStack_3b8 = local_680._8_8_;
                  local_3b0 = local_5e0._0_16_;
                  vpcmpeqd_avx2(ZEXT1632(local_5e0._0_16_),ZEXT1632(local_5e0._0_16_));
                  uStack_39c = (local_710.context)->instID[0];
                  local_3a0 = uStack_39c;
                  uStack_398 = uStack_39c;
                  uStack_394 = uStack_39c;
                  uStack_390 = (local_710.context)->instPrimID[0];
                  uStack_38c = uStack_390;
                  uStack_388 = uStack_390;
                  uStack_384 = uStack_390;
                  local_840 = local_500;
                  uStack_838 = uStack_4f8;
                  local_710.valid = (int *)&local_840;
                  local_710.geometryUserPtr = pGVar10->userPtr;
                  local_710.hit = (RTCHitN *)&local_410;
                  local_710.N = 4;
                  local_6e0._0_4_ = (int)uVar89;
                  local_710.ray = (RTCRayN *)ray;
                  uStack_40c = local_410;
                  uStack_408 = local_410;
                  uStack_404 = local_410;
                  fStack_3dc = local_3e0;
                  fStack_3d8 = local_3e0;
                  fStack_3d4 = local_3e0;
                  uStack_3cc = local_3d0;
                  uStack_3c8 = local_3d0;
                  uStack_3c4 = local_3d0;
                  if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar10->occlusionFilterN)(&local_710);
                    uVar89 = (ulong)(uint)local_6e0._0_4_;
                    auVar202 = ZEXT3264(_local_620);
                    auVar177 = ZEXT3264(local_7c0);
                    auVar214 = ZEXT3264(local_800);
                    auVar208 = ZEXT3264(local_7e0);
                    auVar185 = ZEXT3264(CONCAT428(fStack_744,
                                                  CONCAT424(fStack_748,
                                                            CONCAT420(fStack_74c,
                                                                      CONCAT416(fStack_750,
                                                                                CONCAT412(fStack_754
                                                                                          ,CONCAT48(
                                                  fStack_758,CONCAT44(fStack_75c,local_760))))))));
                    auVar194 = ZEXT3264(local_780);
                    auVar130 = ZEXT3264(local_5c0);
                    auVar154 = ZEXT3264(local_5a0);
                  }
                  auVar76._8_8_ = uStack_838;
                  auVar76._0_8_ = local_840;
                  auVar173 = ZEXT3264(CONCAT428(fStack_724,
                                                CONCAT424(fStack_728,
                                                          CONCAT420(fStack_72c,
                                                                    CONCAT416(fStack_730,
                                                                              CONCAT412(fStack_734,
                                                                                        CONCAT48(
                                                  fStack_738,CONCAT44(fStack_73c,local_740))))))));
                  if (auVar76 == (undefined1  [16])0x0) {
                    auVar12 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                    auVar12 = auVar12 ^ _DAT_01febe20;
                  }
                  else {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var11)(&local_710);
                      uVar89 = (ulong)(uint)local_6e0._0_4_;
                      auVar202 = ZEXT3264(_local_620);
                      auVar177 = ZEXT3264(local_7c0);
                      auVar214 = ZEXT3264(local_800);
                      auVar208 = ZEXT3264(local_7e0);
                      auVar185 = ZEXT3264(CONCAT428(fStack_744,
                                                    CONCAT424(fStack_748,
                                                              CONCAT420(fStack_74c,
                                                                        CONCAT416(fStack_750,
                                                                                  CONCAT412(
                                                  fStack_754,
                                                  CONCAT48(fStack_758,CONCAT44(fStack_75c,local_760)
                                                          )))))));
                      auVar194 = ZEXT3264(local_780);
                      auVar173 = ZEXT3264(CONCAT428(fStack_724,
                                                    CONCAT424(fStack_728,
                                                              CONCAT420(fStack_72c,
                                                                        CONCAT416(fStack_730,
                                                                                  CONCAT412(
                                                  fStack_734,
                                                  CONCAT48(fStack_738,CONCAT44(fStack_73c,local_740)
                                                          )))))));
                      auVar130 = ZEXT3264(local_5c0);
                      auVar154 = ZEXT3264(local_5a0);
                    }
                    auVar77._8_8_ = uStack_838;
                    auVar77._0_8_ = local_840;
                    auVar13 = vpcmpeqd_avx((undefined1  [16])0x0,auVar77);
                    auVar12 = auVar13 ^ _DAT_01febe20;
                    auVar141._8_4_ = 0xff800000;
                    auVar141._0_8_ = 0xff800000ff800000;
                    auVar141._12_4_ = 0xff800000;
                    auVar13 = vblendvps_avx(auVar141,*(undefined1 (*) [16])(local_710.ray + 0x80),
                                            auVar13);
                    *(undefined1 (*) [16])(local_710.ray + 0x80) = auVar13;
                  }
                  auVar166 = auVar177._0_32_;
                  auVar120._8_8_ = 0x100000001;
                  auVar120._0_8_ = 0x100000001;
                  auVar160 = auVar130._0_32_;
                  auVar142 = auVar154._0_32_;
                  if ((auVar120 & auVar12) != (undefined1  [16])0x0) break;
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_6c0._0_4_;
                  uVar19 = uVar84 & 0x3f;
                  uVar84 = 0;
                  uVar87 = uVar87 ^ 1L << uVar19;
                  for (uVar19 = uVar87; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000
                      ) {
                    uVar84 = uVar84 + 1;
                  }
                  uVar89 = CONCAT71((int7)(uVar89 >> 8),uVar87 != 0);
                } while (uVar87 != 0);
              }
              local_5a0 = auVar142;
              local_5c0 = auVar160;
              uVar89 = uVar89 & 0xffffffffffffff01;
            }
          }
          auVar130 = ZEXT3264(local_7a0);
        }
      }
      if (8 < iVar9) {
        local_340._4_4_ = iVar9;
        local_340._0_4_ = iVar9;
        local_340._8_4_ = iVar9;
        local_340._12_4_ = iVar9;
        local_340._16_4_ = iVar9;
        local_340._20_4_ = iVar9;
        local_340._24_4_ = iVar9;
        local_340._28_4_ = iVar9;
        local_e0 = fVar131;
        fStack_dc = fVar131;
        fStack_d8 = fVar131;
        fStack_d4 = fVar131;
        fStack_d0 = fVar131;
        fStack_cc = fVar131;
        fStack_c8 = fVar131;
        fStack_c4 = fVar131;
        local_100 = local_820._0_4_;
        uStack_fc = local_820._0_4_;
        uStack_f8 = local_820._0_4_;
        uStack_f4 = local_820._0_4_;
        uStack_f0 = local_820._0_4_;
        uStack_ec = local_820._0_4_;
        uStack_e8 = local_820._0_4_;
        uStack_e4 = local_820._0_4_;
        local_120 = 1.0 / (float)local_460._0_4_;
        fStack_11c = local_120;
        fStack_118 = local_120;
        fStack_114 = local_120;
        fStack_110 = local_120;
        fStack_10c = local_120;
        fStack_108 = local_120;
        fStack_104 = local_120;
        local_2f0 = (undefined4)local_828;
        uStack_2ec = (undefined4)local_828;
        uStack_2e8 = (undefined4)local_828;
        uStack_2e4 = (undefined4)local_828;
        local_300 = local_520._0_4_;
        uStack_2fc = local_520._0_4_;
        uStack_2f8 = local_520._0_4_;
        uStack_2f4 = local_520._0_4_;
        lVar85 = 8;
        auVar154 = ZEXT3264(local_660);
        _local_620 = auVar202._0_32_;
        local_7c0 = auVar166;
        do {
          auVar160 = *(undefined1 (*) [32])(bezier_basis0 + lVar85 * 4 + lVar18);
          local_820 = *(undefined1 (*) [32])(lVar18 + 0x2227768 + lVar85 * 4);
          auVar142 = *(undefined1 (*) [32])(lVar18 + 0x2227bec + lVar85 * 4);
          pauVar1 = (undefined1 (*) [32])(lVar18 + 0x2228070 + lVar85 * 4);
          auVar80 = *(undefined1 (*) [28])*pauVar1;
          auVar177._0_4_ = auVar185._0_4_ * *(float *)*pauVar1;
          auVar177._4_4_ = auVar185._4_4_ * *(float *)(*pauVar1 + 4);
          auVar177._8_4_ = auVar185._8_4_ * *(float *)(*pauVar1 + 8);
          auVar177._12_4_ = auVar185._12_4_ * *(float *)(*pauVar1 + 0xc);
          auVar177._16_4_ = auVar185._16_4_ * *(float *)(*pauVar1 + 0x10);
          auVar177._20_4_ = auVar185._20_4_ * *(float *)(*pauVar1 + 0x14);
          auVar177._28_36_ = auVar202._28_36_;
          auVar177._24_4_ = auVar185._24_4_ * *(float *)(*pauVar1 + 0x18);
          auVar146._4_4_ = auVar173._4_4_ * *(float *)(*pauVar1 + 4);
          auVar146._0_4_ = auVar173._0_4_ * *(float *)*pauVar1;
          auVar146._8_4_ = auVar173._8_4_ * *(float *)(*pauVar1 + 8);
          auVar146._12_4_ = auVar173._12_4_ * *(float *)(*pauVar1 + 0xc);
          auVar146._16_4_ = auVar173._16_4_ * *(float *)(*pauVar1 + 0x10);
          auVar146._20_4_ = auVar173._20_4_ * *(float *)(*pauVar1 + 0x14);
          auVar146._24_4_ = auVar173._24_4_ * *(float *)(*pauVar1 + 0x18);
          auVar146._28_4_ = *(undefined4 *)(*pauVar1 + 0x1c);
          auVar193 = auVar194._0_32_;
          auVar12 = vfmadd231ps_fma(auVar177._0_32_,auVar142,auVar193);
          auVar13 = vfmadd231ps_fma(auVar146,auVar142,auVar130._0_32_);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_820,auVar208._0_32_);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),local_820,auVar154._0_32_);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar160,auVar214._0_32_);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar160,local_4c0);
          auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar85 * 4 + lVar18);
          auVar150 = *(undefined1 (*) [32])(lVar18 + 0x2229b88 + lVar85 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar18 + 0x222a00c + lVar85 * 4);
          pauVar2 = (undefined1 (*) [16])(lVar18 + 0x222a490 + lVar85 * 4);
          fVar112 = *(float *)*pauVar2;
          fVar67 = *(float *)(*pauVar2 + 4);
          fVar68 = *(float *)(*pauVar2 + 8);
          auVar81 = *(undefined1 (*) [12])*pauVar2;
          fVar69 = *(float *)(*pauVar2 + 0xc);
          fStack_450 = *(float *)pauVar2[1];
          fStack_44c = *(float *)(pauVar2[1] + 4);
          fStack_448 = *(float *)(pauVar2[1] + 8);
          uStack_444 = *(undefined4 *)(pauVar2[1] + 0xc);
          auVar194._0_4_ = auVar185._0_4_ * fVar112;
          auVar194._4_4_ = auVar185._4_4_ * fVar67;
          auVar194._8_4_ = auVar185._8_4_ * fVar68;
          auVar194._12_4_ = auVar185._12_4_ * fVar69;
          auVar194._16_4_ = auVar185._16_4_ * fStack_450;
          auVar194._20_4_ = auVar185._20_4_ * fStack_44c;
          auVar194._28_36_ = auVar185._28_36_;
          auVar194._24_4_ = auVar185._24_4_ * fStack_448;
          auVar202._0_4_ = fVar112 * auVar173._0_4_;
          auVar202._4_4_ = fVar67 * auVar173._4_4_;
          auVar202._8_4_ = fVar68 * auVar173._8_4_;
          auVar202._12_4_ = fVar69 * auVar173._12_4_;
          auVar202._16_4_ = fStack_450 * auVar173._16_4_;
          auVar202._20_4_ = fStack_44c * auVar173._20_4_;
          auVar202._28_36_ = auVar154._28_36_;
          auVar202._24_4_ = fStack_448 * auVar173._24_4_;
          auVar14 = vfmadd231ps_fma(auVar194._0_32_,auVar104,auVar193);
          auVar15 = vfmadd231ps_fma(auVar202._0_32_,auVar104,auVar130._0_32_);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar150,auVar208._0_32_);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar150,auVar154._0_32_);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar98,auVar214._0_32_);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar98,local_4c0);
          auVar182 = ZEXT1632(auVar14);
          auVar200 = ZEXT1632(auVar12);
          _local_4e0 = vsubps_avx(auVar182,auVar200);
          auVar105 = ZEXT1632(auVar15);
          auVar146 = ZEXT1632(auVar13);
          _local_500 = vsubps_avx(auVar105,auVar146);
          auVar66._4_4_ = local_4e0._4_4_ * auVar13._4_4_;
          auVar66._0_4_ = local_4e0._0_4_ * auVar13._0_4_;
          auVar66._8_4_ = local_4e0._8_4_ * auVar13._8_4_;
          auVar66._12_4_ = local_4e0._12_4_ * auVar13._12_4_;
          auVar66._16_4_ = local_4e0._16_4_ * 0.0;
          auVar66._20_4_ = local_4e0._20_4_ * 0.0;
          auVar66._24_4_ = local_4e0._24_4_ * 0.0;
          auVar66._28_4_ = local_4c0._28_4_;
          fVar131 = local_500._0_4_;
          auVar154._0_4_ = auVar12._0_4_ * fVar131;
          fVar132 = local_500._4_4_;
          auVar154._4_4_ = auVar12._4_4_ * fVar132;
          fVar107 = local_500._8_4_;
          auVar154._8_4_ = auVar12._8_4_ * fVar107;
          fVar108 = local_500._12_4_;
          auVar154._12_4_ = auVar12._12_4_ * fVar108;
          fVar109 = local_500._16_4_;
          auVar154._16_4_ = fVar109 * 0.0;
          fVar110 = local_500._20_4_;
          auVar154._20_4_ = fVar110 * 0.0;
          fVar111 = local_500._24_4_;
          auVar154._28_36_ = auVar130._28_36_;
          auVar154._24_4_ = fVar111 * 0.0;
          auVar202 = ZEXT3264(*pauVar1);
          auVar106 = vsubps_avx(auVar66,auVar154._0_32_);
          auVar130._0_4_ = auVar80._0_4_ * (float)local_160._0_4_;
          auVar130._4_4_ = auVar80._4_4_ * (float)local_160._4_4_;
          auVar130._8_4_ = auVar80._8_4_ * fStack_158;
          auVar130._12_4_ = auVar80._12_4_ * fStack_154;
          auVar130._16_4_ = auVar80._16_4_ * fStack_150;
          auVar130._20_4_ = auVar80._20_4_ * fStack_14c;
          auVar130._28_36_ = auVar173._28_36_;
          auVar130._24_4_ = auVar80._24_4_ * fStack_148;
          auVar12 = vfmadd231ps_fma(auVar130._0_32_,auVar142,local_a0);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_820,local_80);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_140,auVar160);
          auVar38._4_4_ = fVar67 * (float)local_160._4_4_;
          auVar38._0_4_ = fVar112 * (float)local_160._0_4_;
          auVar38._8_4_ = fVar68 * fStack_158;
          auVar38._12_4_ = fVar69 * fStack_154;
          auVar38._16_4_ = fStack_450 * fStack_150;
          auVar38._20_4_ = fStack_44c * fStack_14c;
          auVar38._24_4_ = fStack_448 * fStack_148;
          auVar38._28_4_ = uStack_144;
          auVar14 = vfmadd231ps_fma(auVar38,auVar104,local_a0);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar150,local_80);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar98,local_140);
          auVar39._4_4_ = fVar132 * fVar132;
          auVar39._0_4_ = fVar131 * fVar131;
          auVar39._8_4_ = fVar107 * fVar107;
          auVar39._12_4_ = fVar108 * fVar108;
          auVar39._16_4_ = fVar109 * fVar109;
          auVar39._20_4_ = fVar110 * fVar110;
          auVar39._24_4_ = fVar111 * fVar111;
          auVar39._28_4_ = local_140._28_4_;
          auVar15 = vfmadd231ps_fma(auVar39,_local_4e0,_local_4e0);
          auVar128 = ZEXT1632(auVar14);
          auVar126 = vmaxps_avx(ZEXT1632(auVar12),auVar128);
          auVar188._0_4_ = auVar126._0_4_ * auVar126._0_4_ * auVar15._0_4_;
          auVar188._4_4_ = auVar126._4_4_ * auVar126._4_4_ * auVar15._4_4_;
          auVar188._8_4_ = auVar126._8_4_ * auVar126._8_4_ * auVar15._8_4_;
          auVar188._12_4_ = auVar126._12_4_ * auVar126._12_4_ * auVar15._12_4_;
          auVar188._16_4_ = auVar126._16_4_ * auVar126._16_4_ * 0.0;
          auVar188._20_4_ = auVar126._20_4_ * auVar126._20_4_ * 0.0;
          auVar188._24_4_ = auVar126._24_4_ * auVar126._24_4_ * 0.0;
          auVar188._28_4_ = 0;
          auVar40._4_4_ = auVar106._4_4_ * auVar106._4_4_;
          auVar40._0_4_ = auVar106._0_4_ * auVar106._0_4_;
          auVar40._8_4_ = auVar106._8_4_ * auVar106._8_4_;
          auVar40._12_4_ = auVar106._12_4_ * auVar106._12_4_;
          auVar40._16_4_ = auVar106._16_4_ * auVar106._16_4_;
          auVar40._20_4_ = auVar106._20_4_ * auVar106._20_4_;
          auVar40._24_4_ = auVar106._24_4_ * auVar106._24_4_;
          auVar40._28_4_ = auVar106._28_4_;
          auVar126 = vcmpps_avx(auVar40,auVar188,2);
          local_260 = (int)lVar85;
          auVar189._4_4_ = local_260;
          auVar189._0_4_ = local_260;
          auVar189._8_4_ = local_260;
          auVar189._12_4_ = local_260;
          auVar189._16_4_ = local_260;
          auVar189._20_4_ = local_260;
          auVar189._24_4_ = local_260;
          auVar189._28_4_ = local_260;
          auVar106 = vpor_avx2(auVar189,_DAT_0205a920);
          auVar187 = vpcmpgtd_avx2(local_340,auVar106);
          auVar106 = auVar187 & auVar126;
          if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar106 >> 0x7f,0) == '\0') &&
                (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar106 >> 0xbf,0) == '\0') &&
              (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar106[0x1f]) {
            auVar154 = ZEXT3264(local_660);
            auVar130 = ZEXT3264(local_7a0);
            auVar173 = ZEXT3264(CONCAT428(fStack_724,
                                          CONCAT424(fStack_728,
                                                    CONCAT420(fStack_72c,
                                                              CONCAT416(fStack_730,
                                                                        CONCAT412(fStack_734,
                                                                                  CONCAT48(
                                                  fStack_738,CONCAT44(fStack_73c,local_740))))))));
            auVar194 = ZEXT3264(auVar193);
            auVar185 = ZEXT3264(CONCAT428(fStack_744,
                                          CONCAT424(fStack_748,
                                                    CONCAT420(fStack_74c,
                                                              CONCAT416(fStack_750,
                                                                        CONCAT412(fStack_754,
                                                                                  CONCAT48(
                                                  fStack_758,CONCAT44(fStack_75c,local_760))))))));
            auVar208 = ZEXT3264(local_7e0);
            auVar214 = ZEXT3264(local_800);
          }
          else {
            local_c0 = vandps_avx(auVar187,auVar126);
            local_460._0_4_ = auVar81._0_4_;
            local_460._4_4_ = auVar81._4_4_;
            fStack_458 = auVar81._8_4_;
            auVar41._4_4_ = (float)local_620._4_4_ * (float)local_460._4_4_;
            auVar41._0_4_ = (float)local_620._0_4_ * (float)local_460._0_4_;
            auVar41._8_4_ = fStack_618 * fStack_458;
            auVar41._12_4_ = fStack_614 * fVar69;
            auVar41._16_4_ = fStack_610 * fStack_450;
            auVar41._20_4_ = fStack_60c * fStack_44c;
            auVar41._24_4_ = fStack_608 * fStack_448;
            auVar41._28_4_ = auVar126._28_4_;
            auVar14 = vfmadd213ps_fma(auVar104,local_320,auVar41);
            auVar14 = vfmadd213ps_fma(auVar150,local_440,ZEXT1632(auVar14));
            auVar14 = vfmadd132ps_fma(auVar98,ZEXT1632(auVar14),local_7c0);
            auVar42._4_4_ = auVar80._4_4_ * (float)local_620._4_4_;
            auVar42._0_4_ = auVar80._0_4_ * (float)local_620._0_4_;
            auVar42._8_4_ = auVar80._8_4_ * fStack_618;
            auVar42._12_4_ = auVar80._12_4_ * fStack_614;
            auVar42._16_4_ = auVar80._16_4_ * fStack_610;
            auVar42._20_4_ = auVar80._20_4_ * fStack_60c;
            auVar42._24_4_ = auVar80._24_4_ * fStack_608;
            auVar42._28_4_ = auVar126._28_4_;
            auVar15 = vfmadd213ps_fma(auVar142,local_320,auVar42);
            auVar15 = vfmadd213ps_fma(local_820,local_440,ZEXT1632(auVar15));
            auVar104 = *(undefined1 (*) [32])(lVar18 + 0x22284f4 + lVar85 * 4);
            auVar126 = *(undefined1 (*) [32])(lVar18 + 0x2228978 + lVar85 * 4);
            auVar106 = *(undefined1 (*) [32])(lVar18 + 0x2228dfc + lVar85 * 4);
            pfVar3 = (float *)(lVar18 + 0x2229280 + lVar85 * 4);
            fVar131 = *pfVar3;
            fVar132 = pfVar3[1];
            fVar107 = pfVar3[2];
            fVar108 = pfVar3[3];
            fVar109 = pfVar3[4];
            fVar110 = pfVar3[5];
            fVar111 = pfVar3[6];
            auVar183._0_4_ = fVar131 * local_760;
            auVar183._4_4_ = fVar132 * fStack_75c;
            auVar183._8_4_ = fVar107 * fStack_758;
            auVar183._12_4_ = fVar108 * fStack_754;
            auVar183._16_4_ = fVar109 * fStack_750;
            auVar183._20_4_ = fVar110 * fStack_74c;
            auVar183._24_4_ = fVar111 * fStack_748;
            auVar183._28_4_ = 0;
            auVar43._4_4_ = fVar132 * fStack_73c;
            auVar43._0_4_ = fVar131 * local_740;
            auVar43._8_4_ = fVar107 * fStack_738;
            auVar43._12_4_ = fVar108 * fStack_734;
            auVar43._16_4_ = fVar109 * fStack_730;
            auVar43._20_4_ = fVar110 * fStack_72c;
            auVar43._24_4_ = fVar111 * fStack_728;
            auVar43._28_4_ = *(undefined4 *)(*pauVar1 + 0x1c);
            auVar44._4_4_ = fVar132 * (float)local_620._4_4_;
            auVar44._0_4_ = fVar131 * (float)local_620._0_4_;
            auVar44._8_4_ = fVar107 * fStack_618;
            auVar44._12_4_ = fVar108 * fStack_614;
            auVar44._16_4_ = fVar109 * fStack_610;
            auVar44._20_4_ = fVar110 * fStack_60c;
            auVar44._24_4_ = fVar111 * fStack_608;
            auVar44._28_4_ = pfVar3[7];
            auVar16 = vfmadd231ps_fma(auVar183,auVar106,auVar193);
            auVar17 = vfmadd231ps_fma(auVar43,auVar106,local_7a0);
            auVar94 = vfmadd231ps_fma(auVar44,local_320,auVar106);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar126,local_7e0);
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar126,local_660);
            auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),local_440,auVar126);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar104,local_800);
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar104,local_4c0);
            auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar104,local_7c0);
            pfVar3 = (float *)(lVar18 + 0x222b6a0 + lVar85 * 4);
            fVar131 = *pfVar3;
            fVar132 = pfVar3[1];
            fVar107 = pfVar3[2];
            fVar108 = pfVar3[3];
            fVar109 = pfVar3[4];
            fVar110 = pfVar3[5];
            fVar111 = pfVar3[6];
            auVar45._4_4_ = fStack_75c * fVar132;
            auVar45._0_4_ = local_760 * fVar131;
            auVar45._8_4_ = fStack_758 * fVar107;
            auVar45._12_4_ = fStack_754 * fVar108;
            auVar45._16_4_ = fStack_750 * fVar109;
            auVar45._20_4_ = fStack_74c * fVar110;
            auVar45._24_4_ = fStack_748 * fVar111;
            auVar45._28_4_ = local_4e0._28_4_;
            auVar46._4_4_ = fStack_73c * fVar132;
            auVar46._0_4_ = local_740 * fVar131;
            auVar46._8_4_ = fStack_738 * fVar107;
            auVar46._12_4_ = fStack_734 * fVar108;
            auVar46._16_4_ = fStack_730 * fVar109;
            auVar46._20_4_ = fStack_72c * fVar110;
            auVar46._24_4_ = fStack_728 * fVar111;
            auVar46._28_4_ = local_500._28_4_;
            auVar47._4_4_ = fVar132 * (float)local_620._4_4_;
            auVar47._0_4_ = fVar131 * (float)local_620._0_4_;
            auVar47._8_4_ = fVar107 * fStack_618;
            auVar47._12_4_ = fVar108 * fStack_614;
            auVar47._16_4_ = fVar109 * fStack_610;
            auVar47._20_4_ = fVar110 * fStack_60c;
            auVar47._24_4_ = fVar111 * fStack_608;
            auVar47._28_4_ = pfVar3[7];
            auVar104 = *(undefined1 (*) [32])(lVar18 + 0x222b21c + lVar85 * 4);
            auVar93 = vfmadd231ps_fma(auVar45,auVar104,auVar193);
            auVar133 = vfmadd231ps_fma(auVar46,auVar104,local_7a0);
            auVar116 = vfmadd231ps_fma(auVar47,local_320,auVar104);
            auVar104 = *(undefined1 (*) [32])(lVar18 + 0x222ad98 + lVar85 * 4);
            auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar104,local_7e0);
            auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar104,local_660);
            auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar104,local_440);
            auVar104 = *(undefined1 (*) [32])(lVar18 + 0x222a914 + lVar85 * 4);
            auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar104,local_800);
            auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar104,local_4c0);
            auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),local_7c0,auVar104);
            auVar190._8_4_ = 0x7fffffff;
            auVar190._0_8_ = 0x7fffffff7fffffff;
            auVar190._12_4_ = 0x7fffffff;
            auVar190._16_4_ = 0x7fffffff;
            auVar190._20_4_ = 0x7fffffff;
            auVar190._24_4_ = 0x7fffffff;
            auVar190._28_4_ = 0x7fffffff;
            auVar104 = vandps_avx(ZEXT1632(auVar16),auVar190);
            auVar126 = vandps_avx(ZEXT1632(auVar17),auVar190);
            auVar126 = vmaxps_avx(auVar104,auVar126);
            auVar104 = vandps_avx(ZEXT1632(auVar94),auVar190);
            auVar104 = vmaxps_avx(auVar126,auVar104);
            auVar79._4_4_ = fStack_dc;
            auVar79._0_4_ = local_e0;
            auVar79._8_4_ = fStack_d8;
            auVar79._12_4_ = fStack_d4;
            auVar79._16_4_ = fStack_d0;
            auVar79._20_4_ = fStack_cc;
            auVar79._24_4_ = fStack_c8;
            auVar79._28_4_ = fStack_c4;
            auVar104 = vcmpps_avx(auVar104,auVar79,1);
            auVar106 = vblendvps_avx(ZEXT1632(auVar16),_local_4e0,auVar104);
            auVar187 = vblendvps_avx(ZEXT1632(auVar17),_local_500,auVar104);
            auVar104 = vandps_avx(ZEXT1632(auVar93),auVar190);
            auVar126 = vandps_avx(ZEXT1632(auVar133),auVar190);
            auVar126 = vmaxps_avx(auVar104,auVar126);
            auVar104 = vandps_avx(auVar190,ZEXT1632(auVar116));
            auVar104 = vmaxps_avx(auVar126,auVar104);
            auVar126 = vcmpps_avx(auVar104,auVar79,1);
            auVar104 = vblendvps_avx(ZEXT1632(auVar93),_local_4e0,auVar126);
            auVar126 = vblendvps_avx(ZEXT1632(auVar133),_local_500,auVar126);
            auVar15 = vfmadd213ps_fma(auVar160,local_7c0,ZEXT1632(auVar15));
            auVar16 = vfmadd213ps_fma(auVar106,auVar106,ZEXT832(0) << 0x20);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar187,auVar187);
            auVar160 = vrsqrtps_avx(ZEXT1632(auVar16));
            fVar131 = auVar160._0_4_;
            fVar132 = auVar160._4_4_;
            fVar107 = auVar160._8_4_;
            fVar108 = auVar160._12_4_;
            fVar109 = auVar160._16_4_;
            fVar110 = auVar160._20_4_;
            fVar111 = auVar160._24_4_;
            auVar48._4_4_ = fVar132 * fVar132 * fVar132 * auVar16._4_4_ * -0.5;
            auVar48._0_4_ = fVar131 * fVar131 * fVar131 * auVar16._0_4_ * -0.5;
            auVar48._8_4_ = fVar107 * fVar107 * fVar107 * auVar16._8_4_ * -0.5;
            auVar48._12_4_ = fVar108 * fVar108 * fVar108 * auVar16._12_4_ * -0.5;
            auVar48._16_4_ = fVar109 * fVar109 * fVar109 * -0.0;
            auVar48._20_4_ = fVar110 * fVar110 * fVar110 * -0.0;
            auVar48._24_4_ = fVar111 * fVar111 * fVar111 * -0.0;
            auVar48._28_4_ = 0;
            auVar207._8_4_ = 0x3fc00000;
            auVar207._0_8_ = 0x3fc000003fc00000;
            auVar207._12_4_ = 0x3fc00000;
            auVar207._16_4_ = 0x3fc00000;
            auVar207._20_4_ = 0x3fc00000;
            auVar207._24_4_ = 0x3fc00000;
            auVar207._28_4_ = 0x3fc00000;
            auVar16 = vfmadd231ps_fma(auVar48,auVar207,auVar160);
            fVar131 = auVar16._0_4_;
            fVar132 = auVar16._4_4_;
            auVar49._4_4_ = auVar187._4_4_ * fVar132;
            auVar49._0_4_ = auVar187._0_4_ * fVar131;
            fVar107 = auVar16._8_4_;
            auVar49._8_4_ = auVar187._8_4_ * fVar107;
            fVar108 = auVar16._12_4_;
            auVar49._12_4_ = auVar187._12_4_ * fVar108;
            auVar49._16_4_ = auVar187._16_4_ * 0.0;
            auVar49._20_4_ = auVar187._20_4_ * 0.0;
            auVar49._24_4_ = auVar187._24_4_ * 0.0;
            auVar49._28_4_ = auVar160._28_4_;
            auVar50._4_4_ = fVar132 * -auVar106._4_4_;
            auVar50._0_4_ = fVar131 * -auVar106._0_4_;
            auVar50._8_4_ = fVar107 * -auVar106._8_4_;
            auVar50._12_4_ = fVar108 * -auVar106._12_4_;
            auVar50._16_4_ = -auVar106._16_4_ * 0.0;
            auVar50._20_4_ = -auVar106._20_4_ * 0.0;
            auVar50._24_4_ = -auVar106._24_4_ * 0.0;
            auVar50._28_4_ = auVar187._28_4_;
            auVar16 = vfmadd213ps_fma(auVar104,auVar104,ZEXT832(0) << 0x20);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar126,auVar126);
            auVar160 = vrsqrtps_avx(ZEXT1632(auVar16));
            auVar51._28_4_ = local_500._28_4_;
            auVar51._0_28_ =
                 ZEXT1628(CONCAT412(fVar108 * 0.0,
                                    CONCAT48(fVar107 * 0.0,CONCAT44(fVar132 * 0.0,fVar131 * 0.0))));
            fVar131 = auVar160._0_4_;
            fVar132 = auVar160._4_4_;
            fVar107 = auVar160._8_4_;
            fVar108 = auVar160._12_4_;
            fVar109 = auVar160._16_4_;
            fVar110 = auVar160._20_4_;
            fVar111 = auVar160._24_4_;
            auVar52._4_4_ = fVar132 * fVar132 * fVar132 * auVar16._4_4_ * -0.5;
            auVar52._0_4_ = fVar131 * fVar131 * fVar131 * auVar16._0_4_ * -0.5;
            auVar52._8_4_ = fVar107 * fVar107 * fVar107 * auVar16._8_4_ * -0.5;
            auVar52._12_4_ = fVar108 * fVar108 * fVar108 * auVar16._12_4_ * -0.5;
            auVar52._16_4_ = fVar109 * fVar109 * fVar109 * -0.0;
            auVar52._20_4_ = fVar110 * fVar110 * fVar110 * -0.0;
            auVar52._24_4_ = fVar111 * fVar111 * fVar111 * -0.0;
            auVar52._28_4_ = 0;
            auVar16 = vfmadd231ps_fma(auVar52,auVar207,auVar160);
            fVar131 = auVar16._0_4_;
            fVar132 = auVar16._4_4_;
            auVar53._4_4_ = auVar126._4_4_ * fVar132;
            auVar53._0_4_ = auVar126._0_4_ * fVar131;
            fVar107 = auVar16._8_4_;
            auVar53._8_4_ = auVar126._8_4_ * fVar107;
            fVar108 = auVar16._12_4_;
            auVar53._12_4_ = auVar126._12_4_ * fVar108;
            auVar53._16_4_ = auVar126._16_4_ * 0.0;
            auVar53._20_4_ = auVar126._20_4_ * 0.0;
            auVar53._24_4_ = auVar126._24_4_ * 0.0;
            auVar53._28_4_ = 0;
            auVar54._4_4_ = fVar132 * -auVar104._4_4_;
            auVar54._0_4_ = fVar131 * -auVar104._0_4_;
            auVar54._8_4_ = fVar107 * -auVar104._8_4_;
            auVar54._12_4_ = fVar108 * -auVar104._12_4_;
            auVar54._16_4_ = -auVar104._16_4_ * 0.0;
            auVar54._20_4_ = -auVar104._20_4_ * 0.0;
            auVar54._24_4_ = -auVar104._24_4_ * 0.0;
            auVar54._28_4_ = auVar160._28_4_;
            auVar55._28_4_ = 0xbf000000;
            auVar55._0_28_ =
                 ZEXT1628(CONCAT412(fVar108 * 0.0,
                                    CONCAT48(fVar107 * 0.0,CONCAT44(fVar132 * 0.0,fVar131 * 0.0))));
            auVar16 = vfmadd213ps_fma(auVar49,ZEXT1632(auVar12),auVar200);
            auVar160 = ZEXT1632(auVar12);
            auVar17 = vfmadd213ps_fma(auVar50,auVar160,auVar146);
            auVar94 = vfmadd213ps_fma(auVar51,auVar160,ZEXT1632(auVar15));
            auVar92 = vfnmadd213ps_fma(auVar49,auVar160,auVar200);
            auVar93 = vfmadd213ps_fma(auVar53,auVar128,auVar182);
            auVar117 = vfnmadd213ps_fma(auVar50,auVar160,auVar146);
            auVar133 = vfmadd213ps_fma(auVar54,auVar128,auVar105);
            auVar121 = ZEXT1632(auVar12);
            auVar91 = vfnmadd231ps_fma(ZEXT1632(auVar15),auVar121,auVar51);
            auVar15 = vfmadd213ps_fma(auVar55,auVar128,ZEXT1632(auVar14));
            auVar148 = vfnmadd213ps_fma(auVar53,auVar128,auVar182);
            auVar156 = vfnmadd213ps_fma(auVar54,auVar128,auVar105);
            auVar115 = vfnmadd231ps_fma(ZEXT1632(auVar14),auVar128,auVar55);
            auVar160 = vsubps_avx(ZEXT1632(auVar133),ZEXT1632(auVar117));
            auVar104 = vsubps_avx(ZEXT1632(auVar15),ZEXT1632(auVar91));
            auVar171._0_4_ = auVar160._0_4_ * auVar91._0_4_;
            auVar171._4_4_ = auVar160._4_4_ * auVar91._4_4_;
            auVar171._8_4_ = auVar160._8_4_ * auVar91._8_4_;
            auVar171._12_4_ = auVar160._12_4_ * auVar91._12_4_;
            auVar171._16_4_ = auVar160._16_4_ * 0.0;
            auVar171._20_4_ = auVar160._20_4_ * 0.0;
            auVar171._24_4_ = auVar160._24_4_ * 0.0;
            auVar171._28_4_ = 0;
            auVar116 = vfmsub231ps_fma(auVar171,ZEXT1632(auVar117),auVar104);
            auVar56._4_4_ = auVar92._4_4_ * auVar104._4_4_;
            auVar56._0_4_ = auVar92._0_4_ * auVar104._0_4_;
            auVar56._8_4_ = auVar92._8_4_ * auVar104._8_4_;
            auVar56._12_4_ = auVar92._12_4_ * auVar104._12_4_;
            auVar56._16_4_ = auVar104._16_4_ * 0.0;
            auVar56._20_4_ = auVar104._20_4_ * 0.0;
            auVar56._24_4_ = auVar104._24_4_ * 0.0;
            auVar56._28_4_ = auVar104._28_4_;
            auVar98 = ZEXT1632(auVar92);
            auVar104 = vsubps_avx(ZEXT1632(auVar93),auVar98);
            auVar105 = ZEXT1632(auVar91);
            auVar14 = vfmsub231ps_fma(auVar56,auVar105,auVar104);
            auVar57._4_4_ = auVar117._4_4_ * auVar104._4_4_;
            auVar57._0_4_ = auVar117._0_4_ * auVar104._0_4_;
            auVar57._8_4_ = auVar117._8_4_ * auVar104._8_4_;
            auVar57._12_4_ = auVar117._12_4_ * auVar104._12_4_;
            auVar57._16_4_ = auVar104._16_4_ * 0.0;
            auVar57._20_4_ = auVar104._20_4_ * 0.0;
            auVar57._24_4_ = auVar104._24_4_ * 0.0;
            auVar57._28_4_ = auVar104._28_4_;
            auVar92 = vfmsub231ps_fma(auVar57,auVar98,auVar160);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar92),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar116));
            auVar182 = vcmpps_avx(ZEXT1632(auVar14),ZEXT832(0) << 0x20,2);
            local_820 = vblendvps_avx(ZEXT1632(auVar148),ZEXT1632(auVar16),auVar182);
            auVar160 = vblendvps_avx(ZEXT1632(auVar156),ZEXT1632(auVar17),auVar182);
            auVar104 = vblendvps_avx(ZEXT1632(auVar115),ZEXT1632(auVar94),auVar182);
            auVar126 = vblendvps_avx(auVar98,ZEXT1632(auVar93),auVar182);
            auVar106 = vblendvps_avx(ZEXT1632(auVar117),ZEXT1632(auVar133),auVar182);
            auVar187 = vblendvps_avx(auVar105,ZEXT1632(auVar15),auVar182);
            auVar98 = vblendvps_avx(ZEXT1632(auVar93),auVar98,auVar182);
            auVar146 = vblendvps_avx(ZEXT1632(auVar133),ZEXT1632(auVar117),auVar182);
            auVar14 = vpackssdw_avx(local_c0._0_16_,local_c0._16_16_);
            auVar105 = vblendvps_avx(ZEXT1632(auVar15),auVar105,auVar182);
            auVar98 = vsubps_avx(auVar98,local_820);
            auVar146 = vsubps_avx(auVar146,auVar160);
            auVar193 = vsubps_avx(auVar105,auVar104);
            auVar202 = ZEXT3264(auVar193);
            auVar200 = vsubps_avx(local_820,auVar126);
            auVar97 = vsubps_avx(auVar160,auVar106);
            auVar99 = vsubps_avx(auVar104,auVar187);
            auVar168._0_4_ = auVar193._0_4_ * local_820._0_4_;
            auVar168._4_4_ = auVar193._4_4_ * local_820._4_4_;
            auVar168._8_4_ = auVar193._8_4_ * local_820._8_4_;
            auVar168._12_4_ = auVar193._12_4_ * local_820._12_4_;
            auVar168._16_4_ = auVar193._16_4_ * local_820._16_4_;
            auVar168._20_4_ = auVar193._20_4_ * local_820._20_4_;
            auVar168._24_4_ = auVar193._24_4_ * local_820._24_4_;
            auVar168._28_4_ = 0;
            auVar15 = vfmsub231ps_fma(auVar168,auVar104,auVar98);
            auVar58._4_4_ = auVar98._4_4_ * auVar160._4_4_;
            auVar58._0_4_ = auVar98._0_4_ * auVar160._0_4_;
            auVar58._8_4_ = auVar98._8_4_ * auVar160._8_4_;
            auVar58._12_4_ = auVar98._12_4_ * auVar160._12_4_;
            auVar58._16_4_ = auVar98._16_4_ * auVar160._16_4_;
            auVar58._20_4_ = auVar98._20_4_ * auVar160._20_4_;
            auVar58._24_4_ = auVar98._24_4_ * auVar160._24_4_;
            auVar58._28_4_ = auVar105._28_4_;
            auVar16 = vfmsub231ps_fma(auVar58,local_820,auVar146);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
            auVar169._0_4_ = auVar146._0_4_ * auVar104._0_4_;
            auVar169._4_4_ = auVar146._4_4_ * auVar104._4_4_;
            auVar169._8_4_ = auVar146._8_4_ * auVar104._8_4_;
            auVar169._12_4_ = auVar146._12_4_ * auVar104._12_4_;
            auVar169._16_4_ = auVar146._16_4_ * auVar104._16_4_;
            auVar169._20_4_ = auVar146._20_4_ * auVar104._20_4_;
            auVar169._24_4_ = auVar146._24_4_ * auVar104._24_4_;
            auVar169._28_4_ = 0;
            auVar16 = vfmsub231ps_fma(auVar169,auVar160,auVar193);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
            auVar170._0_4_ = auVar99._0_4_ * auVar126._0_4_;
            auVar170._4_4_ = auVar99._4_4_ * auVar126._4_4_;
            auVar170._8_4_ = auVar99._8_4_ * auVar126._8_4_;
            auVar170._12_4_ = auVar99._12_4_ * auVar126._12_4_;
            auVar170._16_4_ = auVar99._16_4_ * auVar126._16_4_;
            auVar170._20_4_ = auVar99._20_4_ * auVar126._20_4_;
            auVar170._24_4_ = auVar99._24_4_ * auVar126._24_4_;
            auVar170._28_4_ = 0;
            auVar15 = vfmsub231ps_fma(auVar170,auVar200,auVar187);
            auVar59._4_4_ = auVar97._4_4_ * auVar187._4_4_;
            auVar59._0_4_ = auVar97._0_4_ * auVar187._0_4_;
            auVar59._8_4_ = auVar97._8_4_ * auVar187._8_4_;
            auVar59._12_4_ = auVar97._12_4_ * auVar187._12_4_;
            auVar59._16_4_ = auVar97._16_4_ * auVar187._16_4_;
            auVar59._20_4_ = auVar97._20_4_ * auVar187._20_4_;
            auVar59._24_4_ = auVar97._24_4_ * auVar187._24_4_;
            auVar59._28_4_ = auVar187._28_4_;
            auVar17 = vfmsub231ps_fma(auVar59,auVar106,auVar99);
            auVar60._4_4_ = auVar200._4_4_ * auVar106._4_4_;
            auVar60._0_4_ = auVar200._0_4_ * auVar106._0_4_;
            auVar60._8_4_ = auVar200._8_4_ * auVar106._8_4_;
            auVar60._12_4_ = auVar200._12_4_ * auVar106._12_4_;
            auVar60._16_4_ = auVar200._16_4_ * auVar106._16_4_;
            auVar60._20_4_ = auVar200._20_4_ * auVar106._20_4_;
            auVar60._24_4_ = auVar200._24_4_ * auVar106._24_4_;
            auVar60._28_4_ = auVar106._28_4_;
            auVar94 = vfmsub231ps_fma(auVar60,auVar97,auVar126);
            auVar106 = ZEXT832(0) << 0x20;
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar106,ZEXT1632(auVar15));
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar106,ZEXT1632(auVar17));
            auVar126 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(auVar17));
            auVar126 = vcmpps_avx(auVar126,auVar106,2);
            auVar15 = vpackssdw_avx(auVar126._0_16_,auVar126._16_16_);
            auVar15 = vpand_avx(auVar15,auVar14);
            auVar126 = vpmovsxwd_avx2(auVar15);
            if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar126 >> 0x7f,0) == '\0') &&
                  (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar126 >> 0xbf,0) == '\0') &&
                (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar126[0x1f]) {
LAB_016a070b:
              auVar153._8_8_ = uStack_538;
              auVar153._0_8_ = local_540;
              auVar153._16_8_ = uStack_530;
              auVar153._24_8_ = uStack_528;
            }
            else {
              auVar61._4_4_ = auVar146._4_4_ * auVar99._4_4_;
              auVar61._0_4_ = auVar146._0_4_ * auVar99._0_4_;
              auVar61._8_4_ = auVar146._8_4_ * auVar99._8_4_;
              auVar61._12_4_ = auVar146._12_4_ * auVar99._12_4_;
              auVar61._16_4_ = auVar146._16_4_ * auVar99._16_4_;
              auVar61._20_4_ = auVar146._20_4_ * auVar99._20_4_;
              auVar61._24_4_ = auVar146._24_4_ * auVar99._24_4_;
              auVar61._28_4_ = auVar126._28_4_;
              auVar116 = vfmsub231ps_fma(auVar61,auVar97,auVar193);
              auVar172._0_4_ = auVar193._0_4_ * auVar200._0_4_;
              auVar172._4_4_ = auVar193._4_4_ * auVar200._4_4_;
              auVar172._8_4_ = auVar193._8_4_ * auVar200._8_4_;
              auVar172._12_4_ = auVar193._12_4_ * auVar200._12_4_;
              auVar172._16_4_ = auVar193._16_4_ * auVar200._16_4_;
              auVar172._20_4_ = auVar193._20_4_ * auVar200._20_4_;
              auVar172._24_4_ = auVar193._24_4_ * auVar200._24_4_;
              auVar172._28_4_ = 0;
              auVar133 = vfmsub231ps_fma(auVar172,auVar98,auVar99);
              auVar62._4_4_ = auVar98._4_4_ * auVar97._4_4_;
              auVar62._0_4_ = auVar98._0_4_ * auVar97._0_4_;
              auVar62._8_4_ = auVar98._8_4_ * auVar97._8_4_;
              auVar62._12_4_ = auVar98._12_4_ * auVar97._12_4_;
              auVar62._16_4_ = auVar98._16_4_ * auVar97._16_4_;
              auVar62._20_4_ = auVar98._20_4_ * auVar97._20_4_;
              auVar62._24_4_ = auVar98._24_4_ * auVar97._24_4_;
              auVar62._28_4_ = auVar97._28_4_;
              auVar92 = vfmsub231ps_fma(auVar62,auVar200,auVar146);
              auVar94 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar133),ZEXT1632(auVar92));
              auVar93 = vfmadd231ps_fma(ZEXT1632(auVar94),ZEXT1632(auVar116),auVar106);
              auVar126 = vrcpps_avx(ZEXT1632(auVar93));
              auVar201._8_4_ = 0x3f800000;
              auVar201._0_8_ = &DAT_3f8000003f800000;
              auVar201._12_4_ = 0x3f800000;
              auVar201._16_4_ = 0x3f800000;
              auVar201._20_4_ = 0x3f800000;
              auVar201._24_4_ = 0x3f800000;
              auVar201._28_4_ = 0x3f800000;
              auVar202 = ZEXT3264(auVar201);
              auVar94 = vfnmadd213ps_fma(auVar126,ZEXT1632(auVar93),auVar201);
              auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar126,auVar126);
              auVar63._4_4_ = auVar92._4_4_ * auVar104._4_4_;
              auVar63._0_4_ = auVar92._0_4_ * auVar104._0_4_;
              auVar63._8_4_ = auVar92._8_4_ * auVar104._8_4_;
              auVar63._12_4_ = auVar92._12_4_ * auVar104._12_4_;
              auVar63._16_4_ = auVar104._16_4_ * 0.0;
              auVar63._20_4_ = auVar104._20_4_ * 0.0;
              auVar63._24_4_ = auVar104._24_4_ * 0.0;
              auVar63._28_4_ = auVar104._28_4_;
              auVar133 = vfmadd231ps_fma(auVar63,auVar160,ZEXT1632(auVar133));
              auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),ZEXT1632(auVar116),local_820);
              fVar131 = auVar94._0_4_;
              fVar132 = auVar94._4_4_;
              fVar107 = auVar94._8_4_;
              fVar108 = auVar94._12_4_;
              auVar126 = ZEXT1632(CONCAT412(fVar108 * auVar133._12_4_,
                                            CONCAT48(fVar107 * auVar133._8_4_,
                                                     CONCAT44(fVar132 * auVar133._4_4_,
                                                              fVar131 * auVar133._0_4_))));
              uVar113 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar152._4_4_ = uVar113;
              auVar152._0_4_ = uVar113;
              auVar152._8_4_ = uVar113;
              auVar152._12_4_ = uVar113;
              auVar152._16_4_ = uVar113;
              auVar152._20_4_ = uVar113;
              auVar152._24_4_ = uVar113;
              auVar152._28_4_ = uVar113;
              auVar78._4_4_ = uStack_fc;
              auVar78._0_4_ = local_100;
              auVar78._8_4_ = uStack_f8;
              auVar78._12_4_ = uStack_f4;
              auVar78._16_4_ = uStack_f0;
              auVar78._20_4_ = uStack_ec;
              auVar78._24_4_ = uStack_e8;
              auVar78._28_4_ = uStack_e4;
              auVar160 = vcmpps_avx(auVar78,auVar126,2);
              auVar104 = vcmpps_avx(auVar126,auVar152,2);
              auVar160 = vandps_avx(auVar104,auVar160);
              auVar94 = vpackssdw_avx(auVar160._0_16_,auVar160._16_16_);
              auVar15 = vpand_avx(auVar15,auVar94);
              auVar160 = vpmovsxwd_avx2(auVar15);
              if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar160 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar160 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar160 >> 0x7f,0) == '\0') &&
                    (auVar160 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar160 >> 0xbf,0) == '\0') &&
                  (auVar160 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar160[0x1f]) goto LAB_016a070b;
              auVar160 = vcmpps_avx(ZEXT1632(auVar93),ZEXT832(0) << 0x20,4);
              auVar94 = vpackssdw_avx(auVar160._0_16_,auVar160._16_16_);
              auVar15 = vpand_avx(auVar15,auVar94);
              auVar160 = vpmovsxwd_avx2(auVar15);
              auVar153._8_8_ = uStack_538;
              auVar153._0_8_ = local_540;
              auVar153._16_8_ = uStack_530;
              auVar153._24_8_ = uStack_528;
              if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar160 >> 0x7f,0) != '\0') ||
                    (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar160 >> 0xbf,0) != '\0') ||
                  (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar160[0x1f] < '\0') {
                auVar106 = ZEXT1632(CONCAT412(fVar108 * auVar16._12_4_,
                                              CONCAT48(fVar107 * auVar16._8_4_,
                                                       CONCAT44(fVar132 * auVar16._4_4_,
                                                                fVar131 * auVar16._0_4_))));
                auVar64._28_4_ = SUB84(uStack_528,4);
                auVar64._0_28_ =
                     ZEXT1628(CONCAT412(fVar108 * auVar17._12_4_,
                                        CONCAT48(fVar107 * auVar17._8_4_,
                                                 CONCAT44(fVar132 * auVar17._4_4_,
                                                          fVar131 * auVar17._0_4_))));
                auVar184._8_4_ = 0x3f800000;
                auVar184._0_8_ = &DAT_3f8000003f800000;
                auVar184._12_4_ = 0x3f800000;
                auVar184._16_4_ = 0x3f800000;
                auVar184._20_4_ = 0x3f800000;
                auVar184._24_4_ = 0x3f800000;
                auVar184._28_4_ = 0x3f800000;
                auVar104 = vsubps_avx(auVar184,auVar106);
                _local_180 = vblendvps_avx(auVar104,auVar106,auVar182);
                auVar104 = vsubps_avx(auVar184,auVar64);
                local_380 = vblendvps_avx(auVar104,auVar64,auVar182);
                auVar153 = auVar160;
                local_480 = auVar126;
              }
            }
            auVar214 = ZEXT3264(local_800);
            auVar208 = ZEXT3264(local_7e0);
            auVar194 = ZEXT3264(local_780);
            local_520 = auVar128;
            if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar153 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar153 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar153 >> 0x7f,0) == '\0') &&
                  (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar153 >> 0xbf,0) == '\0') &&
                (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar153[0x1f]) {
              auVar154 = ZEXT3264(local_660);
              auVar130 = ZEXT3264(local_7a0);
              auVar173 = ZEXT3264(CONCAT428(fStack_724,
                                            CONCAT424(fStack_728,
                                                      CONCAT420(fStack_72c,
                                                                CONCAT416(fStack_730,
                                                                          CONCAT412(fStack_734,
                                                                                    CONCAT48(
                                                  fStack_738,CONCAT44(fStack_73c,local_740))))))));
              auVar185 = ZEXT3264(CONCAT428(fStack_744,
                                            CONCAT424(fStack_748,
                                                      CONCAT420(fStack_74c,
                                                                CONCAT416(fStack_750,
                                                                          CONCAT412(fStack_754,
                                                                                    CONCAT48(
                                                  fStack_758,CONCAT44(fStack_75c,local_760))))))));
            }
            else {
              auVar160 = vsubps_avx(auVar128,auVar121);
              auVar15 = vfmadd213ps_fma(auVar160,_local_180,auVar121);
              fVar131 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
              auVar65._4_4_ = (auVar15._4_4_ + auVar15._4_4_) * fVar131;
              auVar65._0_4_ = (auVar15._0_4_ + auVar15._0_4_) * fVar131;
              auVar65._8_4_ = (auVar15._8_4_ + auVar15._8_4_) * fVar131;
              auVar65._12_4_ = (auVar15._12_4_ + auVar15._12_4_) * fVar131;
              auVar65._16_4_ = fVar131 * 0.0;
              auVar65._20_4_ = fVar131 * 0.0;
              auVar65._24_4_ = fVar131 * 0.0;
              auVar65._28_4_ = fVar131;
              auVar160 = vcmpps_avx(local_480,auVar65,6);
              auVar104 = auVar153 & auVar160;
              auVar173 = ZEXT3264(CONCAT428(fStack_724,
                                            CONCAT424(fStack_728,
                                                      CONCAT420(fStack_72c,
                                                                CONCAT416(fStack_730,
                                                                          CONCAT412(fStack_734,
                                                                                    CONCAT48(
                                                  fStack_738,CONCAT44(fStack_73c,local_740))))))));
              auVar185 = ZEXT3264(CONCAT428(fStack_744,
                                            CONCAT424(fStack_748,
                                                      CONCAT420(fStack_74c,
                                                                CONCAT416(fStack_750,
                                                                          CONCAT412(fStack_754,
                                                                                    CONCAT48(
                                                  fStack_758,CONCAT44(fStack_75c,local_760))))))));
              if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar104 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar104 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar104 >> 0x7f,0) == '\0') &&
                    (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar104 >> 0xbf,0) == '\0') &&
                  (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar104[0x1f]) {
                auVar154 = ZEXT3264(local_660);
                auVar130 = ZEXT3264(local_7a0);
              }
              else {
                local_200 = vandps_avx(auVar160,auVar153);
                auVar129._8_4_ = 0xbf800000;
                auVar129._0_8_ = 0xbf800000bf800000;
                auVar129._12_4_ = 0xbf800000;
                auVar129._16_4_ = 0xbf800000;
                auVar129._20_4_ = 0xbf800000;
                auVar129._24_4_ = 0xbf800000;
                auVar129._28_4_ = 0xbf800000;
                auVar147._8_4_ = 0x40000000;
                auVar147._0_8_ = 0x4000000040000000;
                auVar147._12_4_ = 0x40000000;
                auVar147._16_4_ = 0x40000000;
                auVar147._20_4_ = 0x40000000;
                auVar147._24_4_ = 0x40000000;
                auVar147._28_4_ = 0x40000000;
                auVar15 = vfmadd213ps_fma(local_380,auVar147,auVar129);
                local_2c0 = _local_180;
                local_2a0 = ZEXT1632(auVar15);
                local_250 = local_630._0_8_;
                uStack_248 = local_630._8_8_;
                local_240 = local_560._0_8_;
                uStack_238 = local_560._8_8_;
                local_230 = local_570._0_8_;
                uStack_228 = local_570._8_8_;
                local_220 = local_490._0_8_;
                uStack_218 = local_490._8_8_;
                pGVar10 = (context->scene->geometries).items[local_828].ptr;
                local_380 = local_2a0;
                if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar82 = 0;
                  auVar130 = ZEXT3264(local_7a0);
                }
                else {
                  auVar130 = ZEXT3264(local_7a0);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (bVar82 = 1, pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_6e0 = ZEXT1632(CONCAT124(auVar13._4_12_,(int)uVar89));
                    fVar131 = (float)local_260;
                    local_1e0[0] = (fVar131 + (float)local_180._0_4_ + 0.0) * local_120;
                    local_1e0[1] = (fVar131 + (float)local_180._4_4_ + 1.0) * fStack_11c;
                    local_1e0[2] = (fVar131 + fStack_178 + 2.0) * fStack_118;
                    local_1e0[3] = (fVar131 + fStack_174 + 3.0) * fStack_114;
                    fStack_1d0 = (fVar131 + fStack_170 + 4.0) * fStack_110;
                    fStack_1cc = (fVar131 + fStack_16c + 5.0) * fStack_10c;
                    fStack_1c8 = (fVar131 + fStack_168 + 6.0) * fStack_108;
                    fStack_1c4 = fVar131 + fStack_164 + 7.0;
                    local_380._0_8_ = auVar15._0_8_;
                    local_380._8_8_ = auVar15._8_8_;
                    local_1c0 = local_380._0_8_;
                    uStack_1b8 = local_380._8_8_;
                    uStack_1b0 = 0;
                    uStack_1a8 = 0;
                    local_1a0 = local_480;
                    uVar86 = vmovmskps_avx(local_200);
                    local_6c0._4_28_ = auVar142._4_28_;
                    local_6c0._0_4_ = (int)CONCAT71((int7)((ulong)pGVar10 >> 8),uVar86 != 0);
                    if (uVar86 != 0) {
                      uVar84 = (ulong)(uVar86 & 0xff);
                      local_880 = ZEXT1632(CONCAT88(auVar12._8_8_,uVar84));
                      lVar88 = 0;
                      for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
                        lVar88 = lVar88 + 1;
                      }
                      local_8c0 = ZEXT1632(CONCAT88(auVar14._8_8_,lVar88));
                      local_5e0 = ZEXT1632(local_560);
                      local_680 = ZEXT1632(local_570);
                      _local_600 = ZEXT1632(local_490);
                      local_6a0._16_16_ = auVar150._16_16_;
                      local_6a0._0_16_ = *local_718;
                      _local_460 = *pauVar2;
                      local_280 = local_480;
                      local_25c = iVar9;
                      do {
                        local_820._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                        local_3e0 = local_1e0[local_8c0._0_8_];
                        local_3d0 = *(undefined4 *)((long)&local_1c0 + local_8c0._0_8_ * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_1a0 + local_8c0._0_8_ * 4);
                        fVar107 = 1.0 - local_3e0;
                        auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar107 * fVar107)),
                                                  ZEXT416((uint)(local_3e0 * fVar107)),
                                                  ZEXT416(0xc0000000));
                        auVar12 = vfmsub132ss_fma(ZEXT416((uint)(local_3e0 * fVar107)),
                                                  ZEXT416((uint)(local_3e0 * local_3e0)),
                                                  ZEXT416(0x40000000));
                        fVar131 = auVar12._0_4_ * 3.0;
                        fVar132 = local_3e0 * local_3e0 * 3.0;
                        auVar164._0_4_ = fVar132 * (float)local_600._0_4_;
                        auVar164._4_4_ = fVar132 * (float)local_600._4_4_;
                        auVar164._8_4_ = fVar132 * fStack_5f8;
                        auVar164._12_4_ = fVar132 * fStack_5f4;
                        auVar136._4_4_ = fVar131;
                        auVar136._0_4_ = fVar131;
                        auVar136._8_4_ = fVar131;
                        auVar136._12_4_ = fVar131;
                        auVar12 = vfmadd132ps_fma(auVar136,auVar164,local_680._0_16_);
                        fVar131 = auVar13._0_4_ * 3.0;
                        auVar157._4_4_ = fVar131;
                        auVar157._0_4_ = fVar131;
                        auVar157._8_4_ = fVar131;
                        auVar157._12_4_ = fVar131;
                        auVar12 = vfmadd132ps_fma(auVar157,auVar12,local_5e0._0_16_);
                        fVar131 = fVar107 * fVar107 * -3.0;
                        local_710.context = context->user;
                        auVar137._4_4_ = fVar131;
                        auVar137._0_4_ = fVar131;
                        auVar137._8_4_ = fVar131;
                        auVar137._12_4_ = fVar131;
                        auVar12 = vfmadd132ps_fma(auVar137,auVar12,local_630);
                        local_410 = auVar12._0_4_;
                        local_400 = vshufps_avx(auVar12,auVar12,0x55);
                        local_3f0 = vshufps_avx(auVar12,auVar12,0xaa);
                        local_3c0 = CONCAT44(uStack_2fc,local_300);
                        uStack_3b8 = CONCAT44(uStack_2f4,uStack_2f8);
                        local_3b0._4_4_ = uStack_2ec;
                        local_3b0._0_4_ = local_2f0;
                        local_3b0._8_4_ = uStack_2e8;
                        local_3b0._12_4_ = uStack_2e4;
                        vpcmpeqd_avx2(ZEXT1632(local_3b0),ZEXT1632(local_3b0));
                        uStack_39c = (local_710.context)->instID[0];
                        local_3a0 = uStack_39c;
                        uStack_398 = uStack_39c;
                        uStack_394 = uStack_39c;
                        uStack_390 = (local_710.context)->instPrimID[0];
                        uStack_38c = uStack_390;
                        uStack_388 = uStack_390;
                        uStack_384 = uStack_390;
                        local_840 = local_6a0._0_8_;
                        uStack_838 = local_6a0._8_8_;
                        local_710.valid = (int *)&local_840;
                        local_710.geometryUserPtr = pGVar10->userPtr;
                        local_710.hit = (RTCHitN *)&local_410;
                        local_710.N = 4;
                        local_710.ray = (RTCRayN *)ray;
                        uStack_40c = local_410;
                        uStack_408 = local_410;
                        uStack_404 = local_410;
                        fStack_3dc = local_3e0;
                        fStack_3d8 = local_3e0;
                        fStack_3d4 = local_3e0;
                        uStack_3cc = local_3d0;
                        uStack_3c8 = local_3d0;
                        uStack_3c4 = local_3d0;
                        if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar202 = ZEXT1664(auVar202._0_16_);
                          (*pGVar10->occlusionFilterN)(&local_710);
                        }
                        auVar74._8_8_ = uStack_838;
                        auVar74._0_8_ = local_840;
                        if (auVar74 == (undefined1  [16])0x0) {
                          auVar12 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar12 = auVar12 ^ _DAT_01febe20;
                        }
                        else {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar202 = ZEXT1664(auVar202._0_16_);
                            (*p_Var11)(&local_710);
                          }
                          auVar75._8_8_ = uStack_838;
                          auVar75._0_8_ = local_840;
                          auVar13 = vpcmpeqd_avx((undefined1  [16])0x0,auVar75);
                          auVar12 = auVar13 ^ _DAT_01febe20;
                          auVar138._8_4_ = 0xff800000;
                          auVar138._0_8_ = 0xff800000ff800000;
                          auVar138._12_4_ = 0xff800000;
                          auVar13 = vblendvps_avx(auVar138,*(undefined1 (*) [16])
                                                            (local_710.ray + 0x80),auVar13);
                          *(undefined1 (*) [16])(local_710.ray + 0x80) = auVar13;
                        }
                        auVar119._8_8_ = 0x100000001;
                        auVar119._0_8_ = 0x100000001;
                        if ((auVar119 & auVar12) != (undefined1  [16])0x0) break;
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_820._0_4_;
                        uVar89 = local_880._0_8_ ^ 1L << (local_8c0._0_8_ & 0x3f);
                        local_880._0_8_ = uVar89;
                        lVar88 = 0;
                        for (uVar84 = uVar89; (uVar84 & 1) == 0;
                            uVar84 = uVar84 >> 1 | 0x8000000000000000) {
                          lVar88 = lVar88 + 1;
                        }
                        local_8c0._0_8_ = lVar88;
                        local_6c0._0_4_ = (int)CONCAT71((int7)((ulong)lVar88 >> 8),uVar89 != 0);
                      } while (uVar89 != 0);
                    }
                    bVar82 = local_6c0[0] & 1;
                    auVar130 = ZEXT3264(local_7a0);
                    auVar173 = ZEXT3264(CONCAT428(fStack_724,
                                                  CONCAT424(fStack_728,
                                                            CONCAT420(fStack_72c,
                                                                      CONCAT416(fStack_730,
                                                                                CONCAT412(fStack_734
                                                                                          ,CONCAT48(
                                                  fStack_738,CONCAT44(fStack_73c,local_740))))))));
                    auVar194 = ZEXT3264(local_780);
                    auVar185 = ZEXT3264(CONCAT428(fStack_744,
                                                  CONCAT424(fStack_748,
                                                            CONCAT420(fStack_74c,
                                                                      CONCAT416(fStack_750,
                                                                                CONCAT412(fStack_754
                                                                                          ,CONCAT48(
                                                  fStack_758,CONCAT44(fStack_75c,local_760))))))));
                    auVar208 = ZEXT3264(local_7e0);
                    auVar214 = ZEXT3264(local_800);
                    uVar89 = (ulong)(uint)local_6e0._0_4_;
                  }
                }
                uVar89 = CONCAT71((int7)(uVar89 >> 8),(byte)uVar89 | bVar82);
                auVar154 = ZEXT3264(local_660);
              }
            }
          }
          lVar85 = lVar85 + 8;
        } while ((int)lVar85 < iVar9);
      }
      if ((uVar89 & 1) != 0) {
        return local_8cd;
      }
      uVar113 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar96._4_4_ = uVar113;
      auVar96._0_4_ = uVar113;
      auVar96._8_4_ = uVar113;
      auVar96._12_4_ = uVar113;
      auVar12 = vcmpps_avx(local_2e0,auVar96,2);
      uVar86 = vmovmskps_avx(auVar12);
      uVar83 = uVar83 & uVar83 + 0xf & uVar86;
      local_8cd = uVar83 != 0;
    } while (local_8cd);
  }
  return local_8cd;
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }